

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_flac__decode_samples_with_residual__rice__scalar
                    (ma_dr_flac_bs *bs,ma_uint32 bitsPerSample,ma_uint32 count,ma_uint8 riceParam,
                    ma_uint32 lpcOrder,ma_int32 lpcShift,ma_uint32 lpcPrecision,
                    ma_int32 *coefficients,ma_int32 *pSamplesOut)

{
  ma_dr_flac_cache_t mVar1;
  ushort uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ma_bool32 mVar6;
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  ushort uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  ma_uint32 mVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  uint uVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  int iVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  int iVar45;
  uint uVar46;
  uint uVar47;
  int iVar48;
  uint uVar49;
  int iVar50;
  int iVar51;
  bool bVar52;
  uint local_100;
  uint local_f8;
  uint local_f0;
  uint local_e8;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  uint local_98;
  int local_64;
  
  if (lpcOrder == 0) {
    if (count != 0) {
      iVar4 = riceParam + 1;
      uVar5 = 0x3f - riceParam;
      uVar9 = bs->cache;
      uVar8 = 0;
      do {
        mVar23 = bs->consumedBits;
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (uVar9 != 0) {
            if (uVar9 < 0x1000000000000000) {
              bVar52 = uVar9 >> 0x20 == 0;
              uVar21 = uVar9 << 0x20;
              if (!bVar52) {
                uVar21 = uVar9;
              }
              iVar35 = (uint)bVar52 * 0x20;
              iVar29 = iVar35 + 0x10;
              uVar3 = uVar21 << 0x10;
              if (0xffffffffffff < uVar21) {
                iVar29 = iVar35;
                uVar3 = uVar21;
              }
              iVar35 = iVar29 + 8;
              uVar21 = uVar3 << 8;
              if (0xffffffffffffff < uVar3) {
                iVar35 = iVar29;
                uVar21 = uVar3;
              }
              iVar29 = iVar35 + 4;
              uVar3 = uVar21 << 4;
              if (0xfffffffffffffff < uVar21) {
                iVar29 = iVar35;
                uVar3 = uVar21;
              }
              iVar29 = iVar29 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                        (uVar3 >> 0x3c) * 4);
            }
            else {
              iVar29 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                               (uVar9 >> 0x3c) * 4);
            }
            uVar46 = iVar29 - 1;
            goto LAB_0016ac29;
          }
LAB_0016ac37:
          uVar30 = 0x40 - mVar23;
          do {
            uVar46 = bs->nextL2Line;
            if ((ulong)uVar46 < 0x200) {
              uVar18 = bs->crc16;
              uVar43 = (uint)uVar18;
              if (bs->crc16CacheIgnoredBytes < 8) {
                mVar1 = bs->crc16Cache;
                uVar25 = (uint)mVar1;
                uVar2 = (ushort)(mVar1 >> 0x30);
                uVar17 = (uint)(mVar1 >> 0x10);
                uVar27 = (uint)(mVar1 >> 0x18);
                uVar24 = (uint)(mVar1 >> 0x20);
                switch(bs->crc16CacheIgnoredBytes) {
                case 0:
                  bs->crc16 = ma_dr_flac__crc16_table
                              [((uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [(uVar24 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar18 >> 8) ^
                                                       (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar2 ^
                                                      ((uint)uVar18 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar18 >> 8) ^
                                                             (uint)(byte)(mVar1 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uVar24 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar24 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar2 ^
                                                                              ((uint)uVar18 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar27 & 0xff] <<
                                8 ^ uVar25 ^
                               (uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar24 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar18 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar24 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar24 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar18 >> 8) ^
                                                              (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar18 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar18 >> 8) ^
                                                                    (uint)(byte)(mVar1 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar24 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar24 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar27 & 0xff]) >> 8 & 0xff ^ uVar17 & 0xffff) & 0xff]
                               ) >> 8 & 0xff] << 8 ^
                              ma_dr_flac__crc16_table
                              [(((uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar24 ^ ((uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar18 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff] << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uVar24 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [((uint)ma_dr_flac__crc16_table
                                                       [(uVar24 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar18 >> 8) ^
                                                                (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar18 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar24 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar24 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                uVar27 & 0xff]) >> 8 & 0xff ^ uVar17 & 0xffff) &
                                        0xff] << 8 ^
                                (uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [((uint)ma_dr_flac__crc16_table
                                                      [(uVar24 >> 8 ^
                                                       ((uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar18 >> 8) ^
                                                               (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar18 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                       0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar24 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar18 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar24 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                               uVar27 & 0xff] << 8 ^ uVar25 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(((uint)ma_dr_flac__crc16_table
                                                      [(uVar24 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar24 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar24 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar24 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar24 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar27 & 0xff]) >> 8 & 0xff ^ uVar17 & 0xffff) &
                                              0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar25) & 0xff];
                  break;
                case 1:
                  uVar43 = (uint)(ushort)(uVar18 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)(uVar2 ^ uVar18 >> 8) & 0xff]);
                case 2:
                  uVar43 = (uint)(ushort)((ushort)(uVar43 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar24 ^ uVar43) >> 8 & 0xff]);
                case 3:
                  uVar43 = (uint)(ushort)((ushort)(uVar43 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar24 ^ uVar43 >> 8) & 0xff]);
                case 4:
                  uVar43 = (uint)(ushort)((ushort)(uVar43 << 8) ^
                                         ma_dr_flac__crc16_table[uVar43 >> 8 ^ uVar27 & 0xff]);
                case 5:
                  uVar43 = (uint)(ushort)((ushort)(uVar43 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar43 >> 8 ^ uVar17 & 0xffff) & 0xff]);
                case 6:
                  uVar18 = (ushort)(uVar43 << 8) ^
                           ma_dr_flac__crc16_table[(uVar25 ^ uVar43) >> 8 & 0xff];
                case 7:
                  uVar18 = uVar18 << 8 ^ ma_dr_flac__crc16_table[(uVar25 ^ uVar18 >> 8) & 0xff];
                  goto LAB_0016ae07;
                }
              }
              else {
LAB_0016ae07:
                bs->crc16 = uVar18;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar46 + 1;
              uVar9 = bs->cacheL2[uVar46];
              uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                      (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                      (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                      (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
              bs->crc16Cache = uVar9;
              mVar23 = 0;
            }
            else {
              mVar6 = ma_dr_flac__reload_cache(bs);
              if (mVar6 == 0) {
                return 0;
              }
              uVar9 = bs->cache;
              mVar23 = bs->consumedBits;
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              if (uVar9 == 0) {
                uVar46 = 0x40;
              }
              else {
                if (uVar9 < 0x1000000000000000) {
                  bVar52 = uVar9 >> 0x20 == 0;
                  uVar21 = uVar9 << 0x20;
                  if (!bVar52) {
                    uVar21 = uVar9;
                  }
                  iVar35 = (uint)bVar52 * 0x20;
                  iVar29 = iVar35 + 0x10;
                  uVar3 = uVar21 << 0x10;
                  if (0xffffffffffff < uVar21) {
                    iVar29 = iVar35;
                    uVar3 = uVar21;
                  }
                  iVar35 = iVar29 + 8;
                  uVar21 = uVar3 << 8;
                  if (0xffffffffffffff < uVar3) {
                    iVar35 = iVar29;
                    uVar21 = uVar3;
                  }
                  iVar29 = iVar35 + 4;
                  uVar3 = uVar21 << 4;
                  if (0xfffffffffffffff < uVar21) {
                    iVar29 = iVar35;
                    uVar3 = uVar21;
                  }
                  iVar29 = iVar29 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                             clz_table_4 + (uVar3 >> 0x3c) * 4);
                }
                else {
                  iVar29 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                   (uVar9 >> 0x3c) * 4);
                }
                uVar46 = iVar29 - 1;
              }
            }
            else {
              uVar46 = (uint)LZCOUNT(uVar9);
            }
            uVar30 = uVar30 + uVar46;
          } while (0x3f < uVar46);
        }
        else {
          uVar46 = (uint)LZCOUNT(uVar9);
LAB_0016ac29:
          uVar30 = uVar46;
          if (0x3f < uVar46) goto LAB_0016ac37;
        }
        uVar9 = uVar9 << ((byte)uVar46 & 0x3f);
        uVar46 = mVar23 + uVar46;
        uVar43 = (uint)(uVar9 >> ((byte)uVar5 & 0x3f));
        if (uVar5 < uVar46) {
          uVar46 = uVar46 - uVar5;
          uVar27 = bs->nextL2Line;
          if ((ulong)uVar27 < 0x200) {
            uVar18 = bs->crc16;
            uVar17 = (uint)uVar18;
            if (bs->crc16CacheIgnoredBytes < 8) {
              mVar1 = bs->crc16Cache;
              uVar19 = (uint)mVar1;
              uVar2 = (ushort)(mVar1 >> 0x30);
              uVar25 = (uint)(mVar1 >> 0x10);
              uVar24 = (uint)(mVar1 >> 0x18);
              uVar37 = (uint)(mVar1 >> 0x20);
              switch(bs->crc16CacheIgnoredBytes) {
              case 0:
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar37 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar18 >> 8) ^
                                                     (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar2 ^
                                                    ((uint)uVar18 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar18 >> 8) ^
                                                           (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff
                                                    ) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar18 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar37 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar24 & 0xff] <<
                              8 ^ uVar19 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar18 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar37 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar37 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar18 >> 8) ^
                                                            (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar2 ^
                                                           ((uint)uVar18 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar18 >> 8) ^
                                                                  (uint)(byte)(mVar1 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] <<
                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                       [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar18 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            uVar24 & 0xff]) >> 8 & 0xff ^ uVar25 & 0xffff) & 0xff])
                             >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar18 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar37 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar37 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar18 >> 8) ^
                                                              (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar18 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar18 >> 8) ^
                                                                    (uint)(byte)(mVar1 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar37 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar24 & 0xff]) >> 8 & 0xff ^ uVar25 & 0xffff) & 0xff]
                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [((uint)ma_dr_flac__crc16_table
                                                            [(uVar37 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar24 & 0xff] << 8 ^ uVar19 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [(((uint)ma_dr_flac__crc16_table
                                                            [(uVar37 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar37 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar18 >> 8) ^
                                                                         (uint)(byte)(mVar1 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar18 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar24 & 0xff]) >> 8 & 0xff ^ uVar25 & 0xffff) &
                                                  0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar19) & 0xff]
                ;
                break;
              case 1:
                uVar17 = (uint)(ushort)(uVar18 << 8 ^
                                       ma_dr_flac__crc16_table[(ushort)(uVar2 ^ uVar18 >> 8) & 0xff]
                                       );
              case 2:
                uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar37 ^ uVar17) >> 8 & 0xff]);
              case 3:
                uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar37 ^ uVar17 >> 8) & 0xff]);
              case 4:
                uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                       ma_dr_flac__crc16_table[uVar17 >> 8 ^ uVar24 & 0xff]);
              case 5:
                uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                       ma_dr_flac__crc16_table
                                       [(uVar17 >> 8 ^ uVar25 & 0xffff) & 0xff]);
              case 6:
                uVar18 = (ushort)(uVar17 << 8) ^
                         ma_dr_flac__crc16_table[(uVar19 ^ uVar17) >> 8 & 0xff];
              case 7:
                uVar18 = uVar18 << 8 ^ ma_dr_flac__crc16_table[(uVar19 ^ uVar18 >> 8) & 0xff];
                goto LAB_0016b10d;
              }
            }
            else {
LAB_0016b10d:
              bs->crc16 = uVar18;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar27 + 1;
            uVar9 = bs->cacheL2[uVar27];
            uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                    (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                    (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                    (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
            bs->crc16Cache = uVar9;
            uVar27 = uVar46;
          }
          else {
            mVar6 = ma_dr_flac__reload_cache(bs);
            if (mVar6 == 0) {
              return 0;
            }
            if (0x40 - (ulong)bs->consumedBits < (ulong)uVar46) {
              return 0;
            }
            uVar9 = bs->cache;
            uVar27 = bs->consumedBits + uVar46;
          }
          uVar43 = uVar43 | (uint)(uVar9 >> (-(byte)uVar46 & 0x3f));
          uVar9 = uVar9 << ((byte)uVar46 & 0x3f);
        }
        else {
          uVar9 = uVar9 << ((byte)iVar4 & 0x3f);
          uVar27 = uVar46 + iVar4;
        }
        bs->cache = uVar9;
        bs->consumedBits = uVar27;
        uVar46 = uVar30 << (riceParam & 0x1f) | uVar43 & ~(uint)(-1L << (riceParam & 0x3f));
        pSamplesOut[uVar8] = uVar46 >> 1 ^ *(uint *)(&DAT_0017a5e0 + (ulong)(uVar46 & 1) * 4);
        uVar8 = uVar8 + 1;
      } while (uVar8 != count);
    }
  }
  else {
    uVar46 = count & 0xfffffffc;
    uVar9 = (ulong)uVar46;
    piVar7 = pSamplesOut + uVar9;
    uVar5 = 0x1f;
    if (lpcOrder != 0) {
      for (; lpcOrder >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar30 = ~(uint)(-1L << (riceParam & 0x3f));
    bVar10 = (byte)lpcShift;
    if (((bitsPerSample + lpcPrecision) - (uVar5 ^ 0x1f)) + 0x20 < 0x21) {
      if (uVar46 != 0) {
        iVar4 = riceParam + 1;
        uVar5 = 0x3f - riceParam;
        uVar8 = bs->cache;
        do {
          mVar23 = bs->consumedBits;
          if (ma_dr_flac__gIsLZCNTSupported == 0) {
            if (uVar8 != 0) {
              if (uVar8 < 0x1000000000000000) {
                bVar52 = uVar8 >> 0x20 == 0;
                uVar21 = uVar8 << 0x20;
                if (!bVar52) {
                  uVar21 = uVar8;
                }
                iVar35 = (uint)bVar52 * 0x20;
                iVar29 = iVar35 + 0x10;
                uVar3 = uVar21 << 0x10;
                if (0xffffffffffff < uVar21) {
                  iVar29 = iVar35;
                  uVar3 = uVar21;
                }
                iVar35 = iVar29 + 8;
                uVar21 = uVar3 << 8;
                if (0xffffffffffffff < uVar3) {
                  iVar35 = iVar29;
                  uVar21 = uVar3;
                }
                iVar29 = iVar35 + 4;
                uVar3 = uVar21 << 4;
                if (0xfffffffffffffff < uVar21) {
                  iVar29 = iVar35;
                  uVar3 = uVar21;
                }
                iVar29 = iVar29 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4
                                          + (uVar3 >> 0x3c) * 4);
              }
              else {
                iVar29 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                 (uVar8 >> 0x3c) * 4);
              }
              uVar43 = iVar29 - 1;
              goto LAB_0016870b;
            }
LAB_0016871a:
            local_100 = 0x40 - mVar23;
            do {
              uVar43 = bs->nextL2Line;
              if ((ulong)uVar43 < 0x200) {
                uVar18 = bs->crc16;
                uVar27 = (uint)uVar18;
                if (bs->crc16CacheIgnoredBytes < 8) {
                  mVar1 = bs->crc16Cache;
                  uVar37 = (uint)mVar1;
                  uVar2 = (ushort)(mVar1 >> 0x30);
                  uVar24 = (uint)(mVar1 >> 0x10);
                  uVar17 = (uint)(mVar1 >> 0x18);
                  uVar25 = (uint)(mVar1 >> 0x20);
                  switch(bs->crc16CacheIgnoredBytes) {
                  case 0:
                    bs->crc16 = ma_dr_flac__crc16_table
                                [((uint)ma_dr_flac__crc16_table
                                        [((uint)ma_dr_flac__crc16_table
                                                [(uVar25 >> 8 ^
                                                 ((uint)ma_dr_flac__crc16_table
                                                        [(uint)(uVar18 >> 8) ^
                                                         (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [((uint)uVar2 ^
                                                        ((uint)uVar18 << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar18 >> 8) ^
                                                               (uint)(byte)(mVar1 >> 0x38)]) >> 8 &
                                                        0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar2 ^
                                                                  ((uint)uVar18 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar18 >> 8) ^
                                                                         (uint)(byte)(mVar1 >> 0x38)
                                                                        ]) >> 8 & 0xff) & 0xff] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [(uVar25 >> 8 ^
                                                                   ((uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar18 >> 8) ^
                                                                           (uint)(byte)(mVar1 >> 
                                                  0x38)] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)uVar2 ^
                                                         ((uint)uVar18 << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar18 >> 8) ^
                                                                (uint)(byte)(mVar1 >> 0x38)]) >> 8 &
                                                         0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 &
                                                  0xff) & 0xff]) >> 8 & 0xff ^ uVar17 & 0xff] << 8 ^
                                  uVar37 ^ (uint)ma_dr_flac__crc16_table
                                                 [(((uint)ma_dr_flac__crc16_table
                                                          [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar25 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar25 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar18 >> 8) ^
                                                                         (uint)(byte)(mVar1 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar18 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar25 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar17 & 0xff]) >> 8 & 0xff ^ uVar24 & 0xffff) &
                                                  0xff]) >> 8 & 0xff] << 8 ^
                                ma_dr_flac__crc16_table
                                [(((uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)uVar2 ^
                                                                     ((uint)uVar18 << 8 ^
                                                                     (uint)ma_dr_flac__crc16_table
                                                                           [(uint)(uVar18 >> 8) ^
                                                                            (uint)(byte)(mVar1 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar25 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar25 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar18 >> 8) ^
                                                                  (uint)(byte)(mVar1 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar18 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)uVar2 ^
                                                                           ((uint)uVar18 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar25 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar17 & 0xff]) >> 8 & 0xff ^ uVar24 & 0xffff) &
                                          0xff] << 8 ^
                                  (uint)ma_dr_flac__crc16_table
                                        [((uint)ma_dr_flac__crc16_table
                                                [((uint)ma_dr_flac__crc16_table
                                                        [(uVar25 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar18 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar25 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                 uVar17 & 0xff] << 8 ^ uVar37 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [(((uint)ma_dr_flac__crc16_table
                                                        [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)uVar2 ^
                                                                           ((uint)uVar18 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar25 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [((uint)ma_dr_flac__crc16_table
                                                               [(uVar25 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)uVar2 ^
                                                                           ((uint)uVar18 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar25 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar17 & 0xff]) >> 8 & 0xff ^ uVar24 & 0xffff) &
                                                0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar37) & 0xff];
                    break;
                  case 1:
                    uVar27 = (uint)(ushort)(uVar18 << 8 ^
                                           ma_dr_flac__crc16_table
                                           [(ushort)(uVar2 ^ uVar18 >> 8) & 0xff]);
                  case 2:
                    uVar27 = (uint)(ushort)((ushort)(uVar27 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar25 ^ uVar27) >> 8 & 0xff]);
                  case 3:
                    uVar27 = (uint)(ushort)((ushort)(uVar27 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar25 ^ uVar27 >> 8) & 0xff]);
                  case 4:
                    uVar27 = (uint)(ushort)((ushort)(uVar27 << 8) ^
                                           ma_dr_flac__crc16_table[uVar27 >> 8 ^ uVar17 & 0xff]);
                  case 5:
                    uVar27 = (uint)(ushort)((ushort)(uVar27 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [(uVar27 >> 8 ^ uVar24 & 0xffff) & 0xff]);
                  case 6:
                    uVar18 = (ushort)(uVar27 << 8) ^
                             ma_dr_flac__crc16_table[(uVar37 ^ uVar27) >> 8 & 0xff];
                  case 7:
                    uVar18 = uVar18 << 8 ^ ma_dr_flac__crc16_table[(uVar37 ^ uVar18 >> 8) & 0xff];
                    goto LAB_0016890f;
                  }
                }
                else {
LAB_0016890f:
                  bs->crc16 = uVar18;
                  bs->crc16CacheIgnoredBytes = 0;
                }
                bs->nextL2Line = uVar43 + 1;
                uVar8 = bs->cacheL2[uVar43];
                uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                        (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                        (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                        (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
                bs->crc16Cache = uVar8;
                mVar23 = 0;
              }
              else {
                mVar6 = ma_dr_flac__reload_cache(bs);
                if (mVar6 == 0) {
                  return 0;
                }
                uVar8 = bs->cache;
                mVar23 = bs->consumedBits;
              }
              if (ma_dr_flac__gIsLZCNTSupported == 0) {
                if (uVar8 == 0) {
                  uVar43 = 0x40;
                }
                else {
                  if (uVar8 < 0x1000000000000000) {
                    bVar52 = uVar8 >> 0x20 == 0;
                    uVar21 = uVar8 << 0x20;
                    if (!bVar52) {
                      uVar21 = uVar8;
                    }
                    iVar35 = (uint)bVar52 * 0x20;
                    iVar29 = iVar35 + 0x10;
                    uVar3 = uVar21 << 0x10;
                    if (0xffffffffffff < uVar21) {
                      iVar29 = iVar35;
                      uVar3 = uVar21;
                    }
                    iVar35 = iVar29 + 8;
                    uVar21 = uVar3 << 8;
                    if (0xffffffffffffff < uVar3) {
                      iVar35 = iVar29;
                      uVar21 = uVar3;
                    }
                    iVar29 = iVar35 + 4;
                    uVar3 = uVar21 << 4;
                    if (0xfffffffffffffff < uVar21) {
                      iVar29 = iVar35;
                      uVar3 = uVar21;
                    }
                    iVar29 = iVar29 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                               clz_table_4 + (uVar3 >> 0x3c) * 4);
                  }
                  else {
                    iVar29 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                     (uVar8 >> 0x3c) * 4);
                  }
                  uVar43 = iVar29 - 1;
                }
              }
              else {
                uVar43 = (uint)LZCOUNT(uVar8);
              }
              local_100 = local_100 + uVar43;
            } while (0x3f < uVar43);
          }
          else {
            uVar43 = (uint)LZCOUNT(uVar8);
LAB_0016870b:
            local_100 = uVar43;
            if (0x3f < uVar43) goto LAB_0016871a;
          }
          uVar8 = uVar8 << ((byte)uVar43 & 0x3f);
          uVar43 = mVar23 + uVar43;
          bVar11 = (byte)uVar5;
          local_e8 = (uint)(uVar8 >> (bVar11 & 0x3f));
          bVar12 = (byte)iVar4;
          if (uVar5 < uVar43) {
            uVar43 = uVar43 - uVar5;
            uVar27 = bs->nextL2Line;
            if ((ulong)uVar27 < 0x200) {
              uVar18 = bs->crc16;
              uVar17 = (uint)uVar18;
              if (bs->crc16CacheIgnoredBytes < 8) {
                mVar1 = bs->crc16Cache;
                uVar19 = (uint)mVar1;
                uVar2 = (ushort)(mVar1 >> 0x30);
                uVar25 = (uint)(mVar1 >> 0x10);
                uVar24 = (uint)(mVar1 >> 0x18);
                uVar37 = (uint)(mVar1 >> 0x20);
                switch(bs->crc16CacheIgnoredBytes) {
                case 0:
                  bs->crc16 = ma_dr_flac__crc16_table
                              [((uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [(uVar37 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar18 >> 8) ^
                                                       (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar2 ^
                                                      ((uint)uVar18 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar18 >> 8) ^
                                                             (uint)(byte)(mVar1 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar37 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar2 ^
                                                                              ((uint)uVar18 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar24 & 0xff] <<
                                8 ^ uVar19 ^
                               (uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar18 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar37 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar37 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar18 >> 8) ^
                                                              (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar18 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar18 >> 8) ^
                                                                    (uint)(byte)(mVar1 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar37 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar24 & 0xff]) >> 8 & 0xff ^ uVar25 & 0xffff) & 0xff]
                               ) >> 8 & 0xff] << 8 ^
                              ma_dr_flac__crc16_table
                              [(((uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar18 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff] << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uVar37 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [((uint)ma_dr_flac__crc16_table
                                                       [(uVar37 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar18 >> 8) ^
                                                                (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar18 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                uVar24 & 0xff]) >> 8 & 0xff ^ uVar25 & 0xffff) &
                                        0xff] << 8 ^
                                (uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [((uint)ma_dr_flac__crc16_table
                                                      [(uVar37 >> 8 ^
                                                       ((uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar18 >> 8) ^
                                                               (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar18 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                       0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar18 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                               uVar24 & 0xff] << 8 ^ uVar19 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(((uint)ma_dr_flac__crc16_table
                                                      [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar37 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar24 & 0xff]) >> 8 & 0xff ^ uVar25 & 0xffff) &
                                              0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar19) & 0xff];
                  break;
                case 1:
                  uVar17 = (uint)(ushort)(uVar18 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)(uVar2 ^ uVar18 >> 8) & 0xff]);
                case 2:
                  uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar37 ^ uVar17) >> 8 & 0xff]);
                case 3:
                  uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar37 ^ uVar17 >> 8) & 0xff]);
                case 4:
                  uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                         ma_dr_flac__crc16_table[uVar17 >> 8 ^ uVar24 & 0xff]);
                case 5:
                  uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar17 >> 8 ^ uVar25 & 0xffff) & 0xff]);
                case 6:
                  uVar18 = (ushort)(uVar17 << 8) ^
                           ma_dr_flac__crc16_table[(uVar19 ^ uVar17) >> 8 & 0xff];
                case 7:
                  uVar18 = uVar18 << 8 ^ ma_dr_flac__crc16_table[(uVar19 ^ uVar18 >> 8) & 0xff];
                  goto LAB_00168c6e;
                }
              }
              else {
LAB_00168c6e:
                bs->crc16 = uVar18;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar27 + 1;
              uVar8 = bs->cacheL2[uVar27];
              uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                      (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                      (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                      (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
              bs->crc16Cache = uVar8;
              mVar23 = uVar43;
            }
            else {
              mVar6 = ma_dr_flac__reload_cache(bs);
              if (mVar6 == 0) {
                return 0;
              }
              if (0x40 - (ulong)bs->consumedBits < (ulong)uVar43) {
                return 0;
              }
              uVar8 = bs->cache;
              mVar23 = bs->consumedBits + uVar43;
            }
            local_e8 = local_e8 | (uint)(uVar8 >> (-(byte)uVar43 & 0x3f));
            uVar8 = uVar8 << ((byte)uVar43 & 0x3f);
          }
          else {
            uVar8 = uVar8 << (bVar12 & 0x3f);
            mVar23 = uVar43 + iVar4;
          }
          bs->cache = uVar8;
          bs->consumedBits = mVar23;
          if (ma_dr_flac__gIsLZCNTSupported == 0) {
            if (uVar8 != 0) {
              if (uVar8 < 0x1000000000000000) {
                bVar52 = uVar8 >> 0x20 == 0;
                uVar21 = uVar8 << 0x20;
                if (!bVar52) {
                  uVar21 = uVar8;
                }
                iVar35 = (uint)bVar52 * 0x20;
                iVar29 = iVar35 + 0x10;
                uVar3 = uVar21 << 0x10;
                if (0xffffffffffff < uVar21) {
                  iVar29 = iVar35;
                  uVar3 = uVar21;
                }
                iVar35 = iVar29 + 8;
                uVar21 = uVar3 << 8;
                if (0xffffffffffffff < uVar3) {
                  iVar35 = iVar29;
                  uVar21 = uVar3;
                }
                iVar29 = iVar35 + 4;
                uVar3 = uVar21 << 4;
                if (0xfffffffffffffff < uVar21) {
                  iVar29 = iVar35;
                  uVar3 = uVar21;
                }
                iVar29 = iVar29 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4
                                          + (uVar3 >> 0x3c) * 4);
              }
              else {
                iVar29 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                 (uVar8 >> 0x3c) * 4);
              }
              uVar43 = iVar29 - 1;
              goto LAB_00168d6d;
            }
LAB_00168d7b:
            uVar27 = 0x40 - mVar23;
            do {
              uVar43 = bs->nextL2Line;
              if ((ulong)uVar43 < 0x200) {
                uVar18 = bs->crc16;
                uVar17 = (uint)uVar18;
                if (bs->crc16CacheIgnoredBytes < 8) {
                  mVar1 = bs->crc16Cache;
                  uVar19 = (uint)mVar1;
                  uVar2 = (ushort)(mVar1 >> 0x30);
                  uVar25 = (uint)(mVar1 >> 0x10);
                  uVar24 = (uint)(mVar1 >> 0x18);
                  uVar37 = (uint)(mVar1 >> 0x20);
                  switch(bs->crc16CacheIgnoredBytes) {
                  case 0:
                    bs->crc16 = ma_dr_flac__crc16_table
                                [((uint)ma_dr_flac__crc16_table
                                        [((uint)ma_dr_flac__crc16_table
                                                [(uVar37 >> 8 ^
                                                 ((uint)ma_dr_flac__crc16_table
                                                        [(uint)(uVar18 >> 8) ^
                                                         (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [((uint)uVar2 ^
                                                        ((uint)uVar18 << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar18 >> 8) ^
                                                               (uint)(byte)(mVar1 >> 0x38)]) >> 8 &
                                                        0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar2 ^
                                                                  ((uint)uVar18 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar18 >> 8) ^
                                                                         (uint)(byte)(mVar1 >> 0x38)
                                                                        ]) >> 8 & 0xff) & 0xff] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [(uVar37 >> 8 ^
                                                                   ((uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar18 >> 8) ^
                                                                           (uint)(byte)(mVar1 >> 
                                                  0x38)] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)uVar2 ^
                                                         ((uint)uVar18 << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar18 >> 8) ^
                                                                (uint)(byte)(mVar1 >> 0x38)]) >> 8 &
                                                         0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 &
                                                  0xff) & 0xff]) >> 8 & 0xff ^ uVar24 & 0xff] << 8 ^
                                  uVar19 ^ (uint)ma_dr_flac__crc16_table
                                                 [(((uint)ma_dr_flac__crc16_table
                                                          [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar37 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar18 >> 8) ^
                                                                         (uint)(byte)(mVar1 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar18 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar24 & 0xff]) >> 8 & 0xff ^ uVar25 & 0xffff) &
                                                  0xff]) >> 8 & 0xff] << 8 ^
                                ma_dr_flac__crc16_table
                                [(((uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)uVar2 ^
                                                                     ((uint)uVar18 << 8 ^
                                                                     (uint)ma_dr_flac__crc16_table
                                                                           [(uint)(uVar18 >> 8) ^
                                                                            (uint)(byte)(mVar1 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar37 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar18 >> 8) ^
                                                                  (uint)(byte)(mVar1 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar18 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)uVar2 ^
                                                                           ((uint)uVar18 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar24 & 0xff]) >> 8 & 0xff ^ uVar25 & 0xffff) &
                                          0xff] << 8 ^
                                  (uint)ma_dr_flac__crc16_table
                                        [((uint)ma_dr_flac__crc16_table
                                                [((uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar18 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                 uVar24 & 0xff] << 8 ^ uVar19 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [(((uint)ma_dr_flac__crc16_table
                                                        [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)uVar2 ^
                                                                           ((uint)uVar18 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [((uint)ma_dr_flac__crc16_table
                                                               [(uVar37 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)uVar2 ^
                                                                           ((uint)uVar18 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar24 & 0xff]) >> 8 & 0xff ^ uVar25 & 0xffff) &
                                                0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar19) & 0xff];
                    break;
                  case 1:
                    uVar17 = (uint)(ushort)(uVar18 << 8 ^
                                           ma_dr_flac__crc16_table
                                           [(ushort)(uVar2 ^ uVar18 >> 8) & 0xff]);
                  case 2:
                    uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar37 ^ uVar17) >> 8 & 0xff]);
                  case 3:
                    uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar37 ^ uVar17 >> 8) & 0xff]);
                  case 4:
                    uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                           ma_dr_flac__crc16_table[uVar17 >> 8 ^ uVar24 & 0xff]);
                  case 5:
                    uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [(uVar17 >> 8 ^ uVar25 & 0xffff) & 0xff]);
                  case 6:
                    uVar18 = (ushort)(uVar17 << 8) ^
                             ma_dr_flac__crc16_table[(uVar19 ^ uVar17) >> 8 & 0xff];
                  case 7:
                    uVar18 = uVar18 << 8 ^ ma_dr_flac__crc16_table[(uVar19 ^ uVar18 >> 8) & 0xff];
                    goto LAB_00168f6c;
                  }
                }
                else {
LAB_00168f6c:
                  bs->crc16 = uVar18;
                  bs->crc16CacheIgnoredBytes = 0;
                }
                bs->nextL2Line = uVar43 + 1;
                uVar8 = bs->cacheL2[uVar43];
                uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                        (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                        (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                        (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
                bs->crc16Cache = uVar8;
                mVar23 = 0;
              }
              else {
                mVar6 = ma_dr_flac__reload_cache(bs);
                if (mVar6 == 0) {
                  return 0;
                }
                uVar8 = bs->cache;
                mVar23 = bs->consumedBits;
              }
              if (ma_dr_flac__gIsLZCNTSupported == 0) {
                if (uVar8 == 0) {
                  uVar43 = 0x40;
                }
                else {
                  if (uVar8 < 0x1000000000000000) {
                    bVar52 = uVar8 >> 0x20 == 0;
                    uVar21 = uVar8 << 0x20;
                    if (!bVar52) {
                      uVar21 = uVar8;
                    }
                    iVar35 = (uint)bVar52 * 0x20;
                    iVar29 = iVar35 + 0x10;
                    uVar3 = uVar21 << 0x10;
                    if (0xffffffffffff < uVar21) {
                      iVar29 = iVar35;
                      uVar3 = uVar21;
                    }
                    iVar35 = iVar29 + 8;
                    uVar21 = uVar3 << 8;
                    if (0xffffffffffffff < uVar3) {
                      iVar35 = iVar29;
                      uVar21 = uVar3;
                    }
                    iVar29 = iVar35 + 4;
                    uVar3 = uVar21 << 4;
                    if (0xfffffffffffffff < uVar21) {
                      iVar29 = iVar35;
                      uVar3 = uVar21;
                    }
                    iVar29 = iVar29 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                               clz_table_4 + (uVar3 >> 0x3c) * 4);
                  }
                  else {
                    iVar29 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                     (uVar8 >> 0x3c) * 4);
                  }
                  uVar43 = iVar29 - 1;
                }
              }
              else {
                uVar43 = (uint)LZCOUNT(uVar8);
              }
              uVar27 = uVar27 + uVar43;
            } while (0x3f < uVar43);
          }
          else {
            uVar43 = (uint)LZCOUNT(uVar8);
LAB_00168d6d:
            uVar27 = uVar43;
            if (0x3f < uVar43) goto LAB_00168d7b;
          }
          uVar8 = uVar8 << ((byte)uVar43 & 0x3f);
          uVar43 = mVar23 + uVar43;
          local_f8 = (uint)(uVar8 >> (bVar11 & 0x3f));
          if (uVar5 < uVar43) {
            uVar43 = uVar43 - uVar5;
            uVar17 = bs->nextL2Line;
            if ((ulong)uVar17 < 0x200) {
              uVar18 = bs->crc16;
              uVar24 = (uint)uVar18;
              if (bs->crc16CacheIgnoredBytes < 8) {
                mVar1 = bs->crc16Cache;
                uVar47 = (uint)mVar1;
                uVar2 = (ushort)(mVar1 >> 0x30);
                uVar37 = (uint)(mVar1 >> 0x10);
                uVar25 = (uint)(mVar1 >> 0x18);
                uVar19 = (uint)(mVar1 >> 0x20);
                switch(bs->crc16CacheIgnoredBytes) {
                case 0:
                  bs->crc16 = ma_dr_flac__crc16_table
                              [((uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [(uVar19 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar18 >> 8) ^
                                                       (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar2 ^
                                                      ((uint)uVar18 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar18 >> 8) ^
                                                             (uint)(byte)(mVar1 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar19 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar2 ^
                                                                              ((uint)uVar18 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar25 & 0xff] <<
                                8 ^ uVar47 ^
                               (uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar18 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar19 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar19 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar18 >> 8) ^
                                                              (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar18 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar18 >> 8) ^
                                                                    (uint)(byte)(mVar1 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar19 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar25 & 0xff]) >> 8 & 0xff ^ uVar37 & 0xffff) & 0xff]
                               ) >> 8 & 0xff] << 8 ^
                              ma_dr_flac__crc16_table
                              [(((uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar18 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff] << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uVar19 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [((uint)ma_dr_flac__crc16_table
                                                       [(uVar19 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar18 >> 8) ^
                                                                (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar18 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                uVar25 & 0xff]) >> 8 & 0xff ^ uVar37 & 0xffff) &
                                        0xff] << 8 ^
                                (uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [((uint)ma_dr_flac__crc16_table
                                                      [(uVar19 >> 8 ^
                                                       ((uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar18 >> 8) ^
                                                               (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar18 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                       0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar18 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                               uVar25 & 0xff] << 8 ^ uVar47 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(((uint)ma_dr_flac__crc16_table
                                                      [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar19 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar25 & 0xff]) >> 8 & 0xff ^ uVar37 & 0xffff) &
                                              0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar47) & 0xff];
                  break;
                case 1:
                  uVar24 = (uint)(ushort)(uVar18 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)(uVar2 ^ uVar18 >> 8) & 0xff]);
                case 2:
                  uVar24 = (uint)(ushort)((ushort)(uVar24 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar19 ^ uVar24) >> 8 & 0xff]);
                case 3:
                  uVar24 = (uint)(ushort)((ushort)(uVar24 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar19 ^ uVar24 >> 8) & 0xff]);
                case 4:
                  uVar24 = (uint)(ushort)((ushort)(uVar24 << 8) ^
                                         ma_dr_flac__crc16_table[uVar24 >> 8 ^ uVar25 & 0xff]);
                case 5:
                  uVar24 = (uint)(ushort)((ushort)(uVar24 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar24 >> 8 ^ uVar37 & 0xffff) & 0xff]);
                case 6:
                  uVar18 = (ushort)(uVar24 << 8) ^
                           ma_dr_flac__crc16_table[(uVar47 ^ uVar24) >> 8 & 0xff];
                case 7:
                  uVar18 = uVar18 << 8 ^ ma_dr_flac__crc16_table[(uVar47 ^ uVar18 >> 8) & 0xff];
                  goto LAB_001692af;
                }
              }
              else {
LAB_001692af:
                bs->crc16 = uVar18;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar17 + 1;
              uVar8 = bs->cacheL2[uVar17];
              uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                      (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                      (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                      (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
              bs->crc16Cache = uVar8;
              mVar23 = uVar43;
            }
            else {
              mVar6 = ma_dr_flac__reload_cache(bs);
              if (mVar6 == 0) {
                return 0;
              }
              if (0x40 - (ulong)bs->consumedBits < (ulong)uVar43) {
                return 0;
              }
              uVar8 = bs->cache;
              mVar23 = bs->consumedBits + uVar43;
            }
            local_f8 = local_f8 | (uint)(uVar8 >> (-(byte)uVar43 & 0x3f));
            uVar8 = uVar8 << ((byte)uVar43 & 0x3f);
          }
          else {
            uVar8 = uVar8 << (bVar12 & 0x3f);
            mVar23 = uVar43 + iVar4;
          }
          bs->cache = uVar8;
          bs->consumedBits = mVar23;
          if (ma_dr_flac__gIsLZCNTSupported == 0) {
            if (uVar8 != 0) {
              if (uVar8 < 0x1000000000000000) {
                bVar52 = uVar8 >> 0x20 == 0;
                uVar21 = uVar8 << 0x20;
                if (!bVar52) {
                  uVar21 = uVar8;
                }
                iVar35 = (uint)bVar52 * 0x20;
                iVar29 = iVar35 + 0x10;
                uVar3 = uVar21 << 0x10;
                if (0xffffffffffff < uVar21) {
                  iVar29 = iVar35;
                  uVar3 = uVar21;
                }
                iVar35 = iVar29 + 8;
                uVar21 = uVar3 << 8;
                if (0xffffffffffffff < uVar3) {
                  iVar35 = iVar29;
                  uVar21 = uVar3;
                }
                iVar29 = iVar35 + 4;
                uVar3 = uVar21 << 4;
                if (0xfffffffffffffff < uVar21) {
                  iVar29 = iVar35;
                  uVar3 = uVar21;
                }
                iVar29 = iVar29 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4
                                          + (uVar3 >> 0x3c) * 4);
              }
              else {
                iVar29 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                 (uVar8 >> 0x3c) * 4);
              }
              uVar43 = iVar29 - 1;
              goto LAB_001693ae;
            }
LAB_001693bc:
            uVar17 = 0x40 - mVar23;
            do {
              uVar43 = bs->nextL2Line;
              if ((ulong)uVar43 < 0x200) {
                uVar18 = bs->crc16;
                uVar24 = (uint)uVar18;
                if (bs->crc16CacheIgnoredBytes < 8) {
                  mVar1 = bs->crc16Cache;
                  uVar47 = (uint)mVar1;
                  uVar2 = (ushort)(mVar1 >> 0x30);
                  uVar37 = (uint)(mVar1 >> 0x10);
                  uVar25 = (uint)(mVar1 >> 0x18);
                  uVar19 = (uint)(mVar1 >> 0x20);
                  switch(bs->crc16CacheIgnoredBytes) {
                  case 0:
                    bs->crc16 = ma_dr_flac__crc16_table
                                [((uint)ma_dr_flac__crc16_table
                                        [((uint)ma_dr_flac__crc16_table
                                                [(uVar19 >> 8 ^
                                                 ((uint)ma_dr_flac__crc16_table
                                                        [(uint)(uVar18 >> 8) ^
                                                         (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [((uint)uVar2 ^
                                                        ((uint)uVar18 << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar18 >> 8) ^
                                                               (uint)(byte)(mVar1 >> 0x38)]) >> 8 &
                                                        0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar2 ^
                                                                  ((uint)uVar18 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar18 >> 8) ^
                                                                         (uint)(byte)(mVar1 >> 0x38)
                                                                        ]) >> 8 & 0xff) & 0xff] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [(uVar19 >> 8 ^
                                                                   ((uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar18 >> 8) ^
                                                                           (uint)(byte)(mVar1 >> 
                                                  0x38)] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)uVar2 ^
                                                         ((uint)uVar18 << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar18 >> 8) ^
                                                                (uint)(byte)(mVar1 >> 0x38)]) >> 8 &
                                                         0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 &
                                                  0xff) & 0xff]) >> 8 & 0xff ^ uVar25 & 0xff] << 8 ^
                                  uVar47 ^ (uint)ma_dr_flac__crc16_table
                                                 [(((uint)ma_dr_flac__crc16_table
                                                          [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar19 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar18 >> 8) ^
                                                                         (uint)(byte)(mVar1 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar18 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar25 & 0xff]) >> 8 & 0xff ^ uVar37 & 0xffff) &
                                                  0xff]) >> 8 & 0xff] << 8 ^
                                ma_dr_flac__crc16_table
                                [(((uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)uVar2 ^
                                                                     ((uint)uVar18 << 8 ^
                                                                     (uint)ma_dr_flac__crc16_table
                                                                           [(uint)(uVar18 >> 8) ^
                                                                            (uint)(byte)(mVar1 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar19 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar18 >> 8) ^
                                                                  (uint)(byte)(mVar1 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar18 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)uVar2 ^
                                                                           ((uint)uVar18 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar25 & 0xff]) >> 8 & 0xff ^ uVar37 & 0xffff) &
                                          0xff] << 8 ^
                                  (uint)ma_dr_flac__crc16_table
                                        [((uint)ma_dr_flac__crc16_table
                                                [((uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar18 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                 uVar25 & 0xff] << 8 ^ uVar47 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [(((uint)ma_dr_flac__crc16_table
                                                        [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)uVar2 ^
                                                                           ((uint)uVar18 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [((uint)ma_dr_flac__crc16_table
                                                               [(uVar19 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)uVar2 ^
                                                                           ((uint)uVar18 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar25 & 0xff]) >> 8 & 0xff ^ uVar37 & 0xffff) &
                                                0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar47) & 0xff];
                    break;
                  case 1:
                    uVar24 = (uint)(ushort)(uVar18 << 8 ^
                                           ma_dr_flac__crc16_table
                                           [(ushort)(uVar2 ^ uVar18 >> 8) & 0xff]);
                  case 2:
                    uVar24 = (uint)(ushort)((ushort)(uVar24 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar19 ^ uVar24) >> 8 & 0xff]);
                  case 3:
                    uVar24 = (uint)(ushort)((ushort)(uVar24 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar19 ^ uVar24 >> 8) & 0xff]);
                  case 4:
                    uVar24 = (uint)(ushort)((ushort)(uVar24 << 8) ^
                                           ma_dr_flac__crc16_table[uVar24 >> 8 ^ uVar25 & 0xff]);
                  case 5:
                    uVar24 = (uint)(ushort)((ushort)(uVar24 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [(uVar24 >> 8 ^ uVar37 & 0xffff) & 0xff]);
                  case 6:
                    uVar18 = (ushort)(uVar24 << 8) ^
                             ma_dr_flac__crc16_table[(uVar47 ^ uVar24) >> 8 & 0xff];
                  case 7:
                    uVar18 = uVar18 << 8 ^ ma_dr_flac__crc16_table[(uVar47 ^ uVar18 >> 8) & 0xff];
                    goto LAB_001695ad;
                  }
                }
                else {
LAB_001695ad:
                  bs->crc16 = uVar18;
                  bs->crc16CacheIgnoredBytes = 0;
                }
                bs->nextL2Line = uVar43 + 1;
                uVar8 = bs->cacheL2[uVar43];
                uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                        (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                        (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                        (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
                bs->crc16Cache = uVar8;
                mVar23 = 0;
              }
              else {
                mVar6 = ma_dr_flac__reload_cache(bs);
                if (mVar6 == 0) {
                  return 0;
                }
                uVar8 = bs->cache;
                mVar23 = bs->consumedBits;
              }
              if (ma_dr_flac__gIsLZCNTSupported == 0) {
                if (uVar8 == 0) {
                  uVar43 = 0x40;
                }
                else {
                  if (uVar8 < 0x1000000000000000) {
                    bVar52 = uVar8 >> 0x20 == 0;
                    uVar21 = uVar8 << 0x20;
                    if (!bVar52) {
                      uVar21 = uVar8;
                    }
                    iVar35 = (uint)bVar52 * 0x20;
                    iVar29 = iVar35 + 0x10;
                    uVar3 = uVar21 << 0x10;
                    if (0xffffffffffff < uVar21) {
                      iVar29 = iVar35;
                      uVar3 = uVar21;
                    }
                    iVar35 = iVar29 + 8;
                    uVar21 = uVar3 << 8;
                    if (0xffffffffffffff < uVar3) {
                      iVar35 = iVar29;
                      uVar21 = uVar3;
                    }
                    iVar29 = iVar35 + 4;
                    uVar3 = uVar21 << 4;
                    if (0xfffffffffffffff < uVar21) {
                      iVar29 = iVar35;
                      uVar3 = uVar21;
                    }
                    iVar29 = iVar29 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                               clz_table_4 + (uVar3 >> 0x3c) * 4);
                  }
                  else {
                    iVar29 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                     (uVar8 >> 0x3c) * 4);
                  }
                  uVar43 = iVar29 - 1;
                }
              }
              else {
                uVar43 = (uint)LZCOUNT(uVar8);
              }
              uVar17 = uVar17 + uVar43;
            } while (0x3f < uVar43);
          }
          else {
            uVar43 = (uint)LZCOUNT(uVar8);
LAB_001693ae:
            uVar17 = uVar43;
            if (0x3f < uVar43) goto LAB_001693bc;
          }
          uVar8 = uVar8 << ((byte)uVar43 & 0x3f);
          uVar43 = mVar23 + uVar43;
          uVar24 = (uint)(uVar8 >> (bVar11 & 0x3f));
          if (uVar5 < uVar43) {
            uVar43 = uVar43 - uVar5;
            uVar25 = bs->nextL2Line;
            if ((ulong)uVar25 < 0x200) {
              uVar18 = bs->crc16;
              uVar37 = (uint)uVar18;
              if (bs->crc16CacheIgnoredBytes < 8) {
                mVar1 = bs->crc16Cache;
                uVar13 = (uint)mVar1;
                uVar2 = (ushort)(mVar1 >> 0x30);
                uVar47 = (uint)(mVar1 >> 0x10);
                uVar19 = (uint)(mVar1 >> 0x18);
                uVar49 = (uint)(mVar1 >> 0x20);
                switch(bs->crc16CacheIgnoredBytes) {
                case 0:
                  bs->crc16 = ma_dr_flac__crc16_table
                              [((uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [(uVar49 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar18 >> 8) ^
                                                       (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar2 ^
                                                      ((uint)uVar18 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar18 >> 8) ^
                                                             (uint)(byte)(mVar1 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uVar49 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar49 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar2 ^
                                                                              ((uint)uVar18 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar19 & 0xff] <<
                                8 ^ uVar13 ^
                               (uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar49 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar18 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar49 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar49 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar18 >> 8) ^
                                                              (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar18 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar18 >> 8) ^
                                                                    (uint)(byte)(mVar1 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar49 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar49 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar19 & 0xff]) >> 8 & 0xff ^ uVar47 & 0xffff) & 0xff]
                               ) >> 8 & 0xff] << 8 ^
                              ma_dr_flac__crc16_table
                              [(((uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar49 ^ ((uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar18 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff] << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uVar49 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [((uint)ma_dr_flac__crc16_table
                                                       [(uVar49 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar18 >> 8) ^
                                                                (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar18 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar49 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar49 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                uVar19 & 0xff]) >> 8 & 0xff ^ uVar47 & 0xffff) &
                                        0xff] << 8 ^
                                (uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [((uint)ma_dr_flac__crc16_table
                                                      [(uVar49 >> 8 ^
                                                       ((uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar18 >> 8) ^
                                                               (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar18 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                       0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar49 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar18 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar49 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                               uVar19 & 0xff] << 8 ^ uVar13 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(((uint)ma_dr_flac__crc16_table
                                                      [(uVar49 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar49 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar49 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar49 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar49 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar19 & 0xff]) >> 8 & 0xff ^ uVar47 & 0xffff) &
                                              0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar13) & 0xff];
                  break;
                case 1:
                  uVar37 = (uint)(ushort)(uVar18 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)(uVar2 ^ uVar18 >> 8) & 0xff]);
                case 2:
                  uVar37 = (uint)(ushort)((ushort)(uVar37 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar49 ^ uVar37) >> 8 & 0xff]);
                case 3:
                  uVar37 = (uint)(ushort)((ushort)(uVar37 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar49 ^ uVar37 >> 8) & 0xff]);
                case 4:
                  uVar37 = (uint)(ushort)((ushort)(uVar37 << 8) ^
                                         ma_dr_flac__crc16_table[uVar37 >> 8 ^ uVar19 & 0xff]);
                case 5:
                  uVar37 = (uint)(ushort)((ushort)(uVar37 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar37 >> 8 ^ uVar47 & 0xffff) & 0xff]);
                case 6:
                  uVar18 = (ushort)(uVar37 << 8) ^
                           ma_dr_flac__crc16_table[(uVar13 ^ uVar37) >> 8 & 0xff];
                case 7:
                  uVar18 = uVar18 << 8 ^ ma_dr_flac__crc16_table[(uVar13 ^ uVar18 >> 8) & 0xff];
                  goto LAB_001698d2;
                }
              }
              else {
LAB_001698d2:
                bs->crc16 = uVar18;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar25 + 1;
              uVar8 = bs->cacheL2[uVar25];
              uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                      (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                      (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                      (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
              bs->crc16Cache = uVar8;
              mVar23 = uVar43;
            }
            else {
              mVar6 = ma_dr_flac__reload_cache(bs);
              if (mVar6 == 0) {
                return 0;
              }
              if (0x40 - (ulong)bs->consumedBits < (ulong)uVar43) {
                return 0;
              }
              uVar8 = bs->cache;
              mVar23 = bs->consumedBits + uVar43;
            }
            uVar24 = uVar24 | (uint)(uVar8 >> (-(byte)uVar43 & 0x3f));
            uVar8 = uVar8 << ((byte)uVar43 & 0x3f);
          }
          else {
            uVar8 = uVar8 << (bVar12 & 0x3f);
            mVar23 = uVar43 + iVar4;
          }
          bs->cache = uVar8;
          bs->consumedBits = mVar23;
          if (ma_dr_flac__gIsLZCNTSupported == 0) {
            if (uVar8 != 0) {
              if (uVar8 < 0x1000000000000000) {
                bVar52 = uVar8 >> 0x20 == 0;
                uVar21 = uVar8 << 0x20;
                if (!bVar52) {
                  uVar21 = uVar8;
                }
                iVar35 = (uint)bVar52 * 0x20;
                iVar29 = iVar35 + 0x10;
                uVar3 = uVar21 << 0x10;
                if (0xffffffffffff < uVar21) {
                  iVar29 = iVar35;
                  uVar3 = uVar21;
                }
                iVar35 = iVar29 + 8;
                uVar21 = uVar3 << 8;
                if (0xffffffffffffff < uVar3) {
                  iVar35 = iVar29;
                  uVar21 = uVar3;
                }
                iVar29 = iVar35 + 4;
                uVar3 = uVar21 << 4;
                if (0xfffffffffffffff < uVar21) {
                  iVar29 = iVar35;
                  uVar3 = uVar21;
                }
                iVar29 = iVar29 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4
                                          + (uVar3 >> 0x3c) * 4);
              }
              else {
                iVar29 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                 (uVar8 >> 0x3c) * 4);
              }
              uVar43 = iVar29 - 1;
              goto LAB_001699d9;
            }
LAB_001699e5:
            uVar25 = 0x40 - mVar23;
            do {
              uVar43 = bs->nextL2Line;
              if ((ulong)uVar43 < 0x200) {
                uVar18 = bs->crc16;
                uVar37 = (uint)uVar18;
                if (bs->crc16CacheIgnoredBytes < 8) {
                  mVar1 = bs->crc16Cache;
                  uVar13 = (uint)mVar1;
                  uVar2 = (ushort)(mVar1 >> 0x30);
                  uVar47 = (uint)(mVar1 >> 0x10);
                  uVar19 = (uint)(mVar1 >> 0x18);
                  uVar49 = (uint)(mVar1 >> 0x20);
                  switch(bs->crc16CacheIgnoredBytes) {
                  case 0:
                    bs->crc16 = ma_dr_flac__crc16_table
                                [((uint)ma_dr_flac__crc16_table
                                        [((uint)ma_dr_flac__crc16_table
                                                [(uVar49 >> 8 ^
                                                 ((uint)ma_dr_flac__crc16_table
                                                        [(uint)(uVar18 >> 8) ^
                                                         (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [((uint)uVar2 ^
                                                        ((uint)uVar18 << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar18 >> 8) ^
                                                               (uint)(byte)(mVar1 >> 0x38)]) >> 8 &
                                                        0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [(uVar49 ^ ((uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar2 ^
                                                                  ((uint)uVar18 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar18 >> 8) ^
                                                                         (uint)(byte)(mVar1 >> 0x38)
                                                                        ]) >> 8 & 0xff) & 0xff] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [(uVar49 >> 8 ^
                                                                   ((uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar18 >> 8) ^
                                                                           (uint)(byte)(mVar1 >> 
                                                  0x38)] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)uVar2 ^
                                                         ((uint)uVar18 << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar18 >> 8) ^
                                                                (uint)(byte)(mVar1 >> 0x38)]) >> 8 &
                                                         0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 &
                                                  0xff) & 0xff]) >> 8 & 0xff ^ uVar19 & 0xff] << 8 ^
                                  uVar13 ^ (uint)ma_dr_flac__crc16_table
                                                 [(((uint)ma_dr_flac__crc16_table
                                                          [(uVar49 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar49 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar49 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar18 >> 8) ^
                                                                         (uint)(byte)(mVar1 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar18 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar49 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar49 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar19 & 0xff]) >> 8 & 0xff ^ uVar47 & 0xffff) &
                                                  0xff]) >> 8 & 0xff] << 8 ^
                                ma_dr_flac__crc16_table
                                [(((uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar49 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)uVar2 ^
                                                                     ((uint)uVar18 << 8 ^
                                                                     (uint)ma_dr_flac__crc16_table
                                                                           [(uint)(uVar18 >> 8) ^
                                                                            (uint)(byte)(mVar1 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar49 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar49 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar18 >> 8) ^
                                                                  (uint)(byte)(mVar1 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar18 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar49 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)uVar2 ^
                                                                           ((uint)uVar18 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar49 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar19 & 0xff]) >> 8 & 0xff ^ uVar47 & 0xffff) &
                                          0xff] << 8 ^
                                  (uint)ma_dr_flac__crc16_table
                                        [((uint)ma_dr_flac__crc16_table
                                                [((uint)ma_dr_flac__crc16_table
                                                        [(uVar49 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [(uVar49 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar18 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar49 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                 uVar19 & 0xff] << 8 ^ uVar13 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [(((uint)ma_dr_flac__crc16_table
                                                        [(uVar49 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)uVar2 ^
                                                                           ((uint)uVar18 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar49 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [((uint)ma_dr_flac__crc16_table
                                                               [(uVar49 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar49 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)uVar2 ^
                                                                           ((uint)uVar18 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar49 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar19 & 0xff]) >> 8 & 0xff ^ uVar47 & 0xffff) &
                                                0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar13) & 0xff];
                    break;
                  case 1:
                    uVar37 = (uint)(ushort)(uVar18 << 8 ^
                                           ma_dr_flac__crc16_table
                                           [(ushort)(uVar2 ^ uVar18 >> 8) & 0xff]);
                  case 2:
                    uVar37 = (uint)(ushort)((ushort)(uVar37 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar49 ^ uVar37) >> 8 & 0xff]);
                  case 3:
                    uVar37 = (uint)(ushort)((ushort)(uVar37 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar49 ^ uVar37 >> 8) & 0xff]);
                  case 4:
                    uVar37 = (uint)(ushort)((ushort)(uVar37 << 8) ^
                                           ma_dr_flac__crc16_table[uVar37 >> 8 ^ uVar19 & 0xff]);
                  case 5:
                    uVar37 = (uint)(ushort)((ushort)(uVar37 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [(uVar37 >> 8 ^ uVar47 & 0xffff) & 0xff]);
                  case 6:
                    uVar18 = (ushort)(uVar37 << 8) ^
                             ma_dr_flac__crc16_table[(uVar13 ^ uVar37) >> 8 & 0xff];
                  case 7:
                    uVar18 = uVar18 << 8 ^ ma_dr_flac__crc16_table[(uVar13 ^ uVar18 >> 8) & 0xff];
                    goto LAB_00169bd5;
                  }
                }
                else {
LAB_00169bd5:
                  bs->crc16 = uVar18;
                  bs->crc16CacheIgnoredBytes = 0;
                }
                bs->nextL2Line = uVar43 + 1;
                uVar8 = bs->cacheL2[uVar43];
                uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                        (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                        (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                        (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
                bs->crc16Cache = uVar8;
                mVar23 = 0;
              }
              else {
                mVar6 = ma_dr_flac__reload_cache(bs);
                if (mVar6 == 0) {
                  return 0;
                }
                uVar8 = bs->cache;
                mVar23 = bs->consumedBits;
              }
              if (ma_dr_flac__gIsLZCNTSupported == 0) {
                if (uVar8 == 0) {
                  uVar43 = 0x40;
                }
                else {
                  if (uVar8 < 0x1000000000000000) {
                    bVar52 = uVar8 >> 0x20 == 0;
                    uVar21 = uVar8 << 0x20;
                    if (!bVar52) {
                      uVar21 = uVar8;
                    }
                    iVar35 = (uint)bVar52 * 0x20;
                    iVar29 = iVar35 + 0x10;
                    uVar3 = uVar21 << 0x10;
                    if (0xffffffffffff < uVar21) {
                      iVar29 = iVar35;
                      uVar3 = uVar21;
                    }
                    iVar35 = iVar29 + 8;
                    uVar21 = uVar3 << 8;
                    if (0xffffffffffffff < uVar3) {
                      iVar35 = iVar29;
                      uVar21 = uVar3;
                    }
                    iVar29 = iVar35 + 4;
                    uVar3 = uVar21 << 4;
                    if (0xfffffffffffffff < uVar21) {
                      iVar29 = iVar35;
                      uVar3 = uVar21;
                    }
                    iVar29 = iVar29 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                               clz_table_4 + (uVar3 >> 0x3c) * 4);
                  }
                  else {
                    iVar29 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                     (uVar8 >> 0x3c) * 4);
                  }
                  uVar43 = iVar29 - 1;
                }
              }
              else {
                uVar43 = (uint)LZCOUNT(uVar8);
              }
              uVar25 = uVar25 + uVar43;
            } while (0x3f < uVar43);
          }
          else {
            uVar43 = (uint)LZCOUNT(uVar8);
LAB_001699d9:
            uVar25 = uVar43;
            if (0x3f < uVar43) goto LAB_001699e5;
          }
          uVar8 = uVar8 << ((byte)uVar43 & 0x3f);
          uVar43 = mVar23 + uVar43;
          uVar37 = (uint)(uVar8 >> (bVar11 & 0x3f));
          if (uVar5 < uVar43) {
            uVar43 = uVar43 - uVar5;
            uVar19 = bs->nextL2Line;
            if ((ulong)uVar19 < 0x200) {
              uVar18 = bs->crc16;
              uVar47 = (uint)uVar18;
              if (bs->crc16CacheIgnoredBytes < 8) {
                mVar1 = bs->crc16Cache;
                uVar14 = (uint)mVar1;
                uVar2 = (ushort)(mVar1 >> 0x30);
                uVar13 = (uint)(mVar1 >> 0x10);
                uVar49 = (uint)(mVar1 >> 0x18);
                uVar16 = (uint)(mVar1 >> 0x20);
                switch(bs->crc16CacheIgnoredBytes) {
                case 0:
                  bs->crc16 = ma_dr_flac__crc16_table
                              [((uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [(uVar16 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar18 >> 8) ^
                                                       (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar2 ^
                                                      ((uint)uVar18 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar18 >> 8) ^
                                                             (uint)(byte)(mVar1 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uVar16 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar16 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar2 ^
                                                                              ((uint)uVar18 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar49 & 0xff] <<
                                8 ^ uVar14 ^
                               (uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar16 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar18 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar16 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar16 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar18 >> 8) ^
                                                              (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar18 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar18 >> 8) ^
                                                                    (uint)(byte)(mVar1 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar16 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar16 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar49 & 0xff]) >> 8 & 0xff ^ uVar13 & 0xffff) & 0xff]
                               ) >> 8 & 0xff] << 8 ^
                              ma_dr_flac__crc16_table
                              [(((uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar16 ^ ((uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar18 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff] << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uVar16 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [((uint)ma_dr_flac__crc16_table
                                                       [(uVar16 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar18 >> 8) ^
                                                                (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar18 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar16 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar16 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                uVar49 & 0xff]) >> 8 & 0xff ^ uVar13 & 0xffff) &
                                        0xff] << 8 ^
                                (uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [((uint)ma_dr_flac__crc16_table
                                                      [(uVar16 >> 8 ^
                                                       ((uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar18 >> 8) ^
                                                               (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar18 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                       0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar16 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar18 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar16 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                               uVar49 & 0xff] << 8 ^ uVar14 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(((uint)ma_dr_flac__crc16_table
                                                      [(uVar16 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar16 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar16 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar16 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar16 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar49 & 0xff]) >> 8 & 0xff ^ uVar13 & 0xffff) &
                                              0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar14) & 0xff];
                  break;
                case 1:
                  uVar47 = (uint)(ushort)(uVar18 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)(uVar2 ^ uVar18 >> 8) & 0xff]);
                case 2:
                  uVar47 = (uint)(ushort)((ushort)(uVar47 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar16 ^ uVar47) >> 8 & 0xff]);
                case 3:
                  uVar47 = (uint)(ushort)((ushort)(uVar47 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar16 ^ uVar47 >> 8) & 0xff]);
                case 4:
                  uVar47 = (uint)(ushort)((ushort)(uVar47 << 8) ^
                                         ma_dr_flac__crc16_table[uVar47 >> 8 ^ uVar49 & 0xff]);
                case 5:
                  uVar47 = (uint)(ushort)((ushort)(uVar47 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar47 >> 8 ^ uVar13 & 0xffff) & 0xff]);
                case 6:
                  uVar18 = (ushort)(uVar47 << 8) ^
                           ma_dr_flac__crc16_table[(uVar14 ^ uVar47) >> 8 & 0xff];
                case 7:
                  uVar18 = uVar18 << 8 ^ ma_dr_flac__crc16_table[(uVar14 ^ uVar18 >> 8) & 0xff];
                  goto LAB_00169f0d;
                }
              }
              else {
LAB_00169f0d:
                bs->crc16 = uVar18;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar19 + 1;
              uVar8 = bs->cacheL2[uVar19];
              uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                      (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                      (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                      (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
              bs->crc16Cache = uVar8;
              uVar19 = uVar43;
            }
            else {
              mVar6 = ma_dr_flac__reload_cache(bs);
              if (mVar6 == 0) {
                return 0;
              }
              if (0x40 - (ulong)bs->consumedBits < (ulong)uVar43) {
                return 0;
              }
              uVar8 = bs->cache;
              uVar19 = bs->consumedBits + uVar43;
            }
            uVar37 = uVar37 | (uint)(uVar8 >> (-(byte)uVar43 & 0x3f));
            uVar8 = uVar8 << ((byte)uVar43 & 0x3f);
          }
          else {
            uVar8 = uVar8 << (bVar12 & 0x3f);
            uVar19 = uVar43 + iVar4;
          }
          bs->cache = uVar8;
          bs->consumedBits = uVar19;
          uVar19 = local_100 << (riceParam & 0x1f) | local_e8 & uVar30;
          uVar49 = uVar27 << (riceParam & 0x1f) | local_f8 & uVar30;
          uVar47 = uVar17 << (riceParam & 0x1f) | uVar24 & uVar30;
          uVar24 = uVar25 << (riceParam & 0x1f) | uVar37 & uVar30;
          uVar43 = *(uint *)(&DAT_0017a5e0 + (ulong)(uVar49 & 1) * 4);
          uVar27 = *(uint *)(&DAT_0017a5e0 + (ulong)(uVar47 & 1) * 4);
          uVar17 = *(uint *)(&DAT_0017a5e0 + (ulong)(uVar24 & 1) * 4);
          iVar31 = lpcOrder - 1;
          iVar34 = 0;
          local_64 = 0;
          local_d8 = 0;
          local_d4 = 0;
          local_d0 = 0;
          local_cc = 0;
          local_c8 = 0;
          local_c4 = 0;
          local_c0 = 0;
          local_bc = 0;
          local_b8 = 0;
          local_b4 = 0;
          local_b0 = 0;
          local_ac = 0;
          local_a8 = 0;
          local_a4 = 0;
          local_a0 = 0;
          iVar29 = 0;
          iVar35 = 0;
          iVar42 = 0;
          iVar20 = 0;
          iVar32 = 0;
          iVar39 = 0;
          iVar41 = 0;
          iVar38 = 0;
          iVar15 = 0;
          iVar22 = 0;
          iVar33 = 0;
          iVar26 = 0;
          iVar50 = 0;
          iVar44 = 0;
          iVar28 = 0;
          switch(iVar31) {
          case 0x1f:
            local_64 = pSamplesOut[-0x20] * coefficients[0x1f];
          case 0x1e:
            local_d8 = pSamplesOut[-0x1f] * coefficients[0x1e] + local_64;
          case 0x1d:
            local_d4 = pSamplesOut[-0x1e] * coefficients[0x1d] + local_d8;
          case 0x1c:
            local_d0 = pSamplesOut[-0x1d] * coefficients[0x1c] + local_d4;
          case 0x1b:
            local_cc = pSamplesOut[-0x1c] * coefficients[0x1b] + local_d0;
          case 0x1a:
            local_c8 = pSamplesOut[-0x1b] * coefficients[0x1a] + local_cc;
          case 0x19:
            local_c4 = pSamplesOut[-0x1a] * coefficients[0x19] + local_c8;
          case 0x18:
            local_c0 = pSamplesOut[-0x19] * coefficients[0x18] + local_c4;
          case 0x17:
            local_bc = pSamplesOut[-0x18] * coefficients[0x17] + local_c0;
          case 0x16:
            local_b8 = pSamplesOut[-0x17] * coefficients[0x16] + local_bc;
          case 0x15:
            local_b4 = pSamplesOut[-0x16] * coefficients[0x15] + local_b8;
          case 0x14:
            local_b0 = pSamplesOut[-0x15] * coefficients[0x14] + local_b4;
          case 0x13:
            local_ac = pSamplesOut[-0x14] * coefficients[0x13] + local_b0;
          case 0x12:
            local_a8 = pSamplesOut[-0x13] * coefficients[0x12] + local_ac;
          case 0x11:
            local_a4 = pSamplesOut[-0x12] * coefficients[0x11] + local_a8;
          case 0x10:
            local_a0 = pSamplesOut[-0x11] * coefficients[0x10] + local_a4;
          case 0xf:
            iVar29 = pSamplesOut[-0x10] * coefficients[0xf] + local_a0;
          case 0xe:
            iVar35 = pSamplesOut[-0xf] * coefficients[0xe] + iVar29;
          case 0xd:
            iVar42 = pSamplesOut[-0xe] * coefficients[0xd] + iVar35;
          case 0xc:
            iVar20 = pSamplesOut[-0xd] * coefficients[0xc] + iVar42;
          case 0xb:
            iVar32 = pSamplesOut[-0xc] * coefficients[0xb] + iVar20;
          case 10:
            iVar39 = pSamplesOut[-0xb] * coefficients[10] + iVar32;
          case 9:
            iVar41 = pSamplesOut[-10] * coefficients[9] + iVar39;
          case 8:
            iVar38 = pSamplesOut[-9] * coefficients[8] + iVar41;
          case 7:
            iVar15 = pSamplesOut[-8] * coefficients[7] + iVar38;
          case 6:
            iVar22 = pSamplesOut[-7] * coefficients[6] + iVar15;
          case 5:
            iVar33 = pSamplesOut[-6] * coefficients[5] + iVar22;
          case 4:
            iVar26 = pSamplesOut[-5] * coefficients[4] + iVar33;
          case 3:
            iVar50 = pSamplesOut[-4] * coefficients[3] + iVar26;
          case 2:
            iVar44 = pSamplesOut[-3] * coefficients[2] + iVar50;
          case 1:
            iVar28 = pSamplesOut[-2] * coefficients[1] + iVar44;
          case 0:
            iVar34 = pSamplesOut[-1] * *coefficients + iVar28;
          }
          iVar29 = 0;
          iVar35 = (iVar34 >> (bVar10 & 0x1f)) +
                   (uVar19 >> 1 ^ *(uint *)(&DAT_0017a5e0 + (ulong)(uVar19 & 1) * 4));
          *pSamplesOut = iVar35;
          switch(iVar31) {
          case 0x1f:
            iVar29 = pSamplesOut[-0x1f] * coefficients[0x1f];
          case 0x1e:
            iVar29 = iVar29 + pSamplesOut[-0x1e] * coefficients[0x1e];
          case 0x1d:
            iVar29 = iVar29 + pSamplesOut[-0x1d] * coefficients[0x1d];
          case 0x1c:
            iVar29 = iVar29 + pSamplesOut[-0x1c] * coefficients[0x1c];
          case 0x1b:
            iVar29 = iVar29 + pSamplesOut[-0x1b] * coefficients[0x1b];
          case 0x1a:
            iVar29 = iVar29 + pSamplesOut[-0x1a] * coefficients[0x1a];
          case 0x19:
            iVar29 = iVar29 + pSamplesOut[-0x19] * coefficients[0x19];
          case 0x18:
            iVar29 = iVar29 + pSamplesOut[-0x18] * coefficients[0x18];
          case 0x17:
            iVar29 = iVar29 + pSamplesOut[-0x17] * coefficients[0x17];
          case 0x16:
            iVar29 = iVar29 + pSamplesOut[-0x16] * coefficients[0x16];
          case 0x15:
            iVar29 = iVar29 + pSamplesOut[-0x15] * coefficients[0x15];
          case 0x14:
            iVar29 = iVar29 + pSamplesOut[-0x14] * coefficients[0x14];
          case 0x13:
            iVar29 = iVar29 + pSamplesOut[-0x13] * coefficients[0x13];
          case 0x12:
            iVar29 = iVar29 + pSamplesOut[-0x12] * coefficients[0x12];
          case 0x11:
            iVar29 = iVar29 + pSamplesOut[-0x11] * coefficients[0x11];
          case 0x10:
            iVar29 = iVar29 + pSamplesOut[-0x10] * coefficients[0x10];
          case 0xf:
            iVar29 = iVar29 + pSamplesOut[-0xf] * coefficients[0xf];
          case 0xe:
            iVar29 = iVar29 + pSamplesOut[-0xe] * coefficients[0xe];
          case 0xd:
            iVar29 = iVar29 + pSamplesOut[-0xd] * coefficients[0xd];
          case 0xc:
            iVar29 = iVar29 + pSamplesOut[-0xc] * coefficients[0xc];
          case 0xb:
            iVar29 = iVar29 + pSamplesOut[-0xb] * coefficients[0xb];
          case 10:
            iVar29 = iVar29 + pSamplesOut[-10] * coefficients[10];
          case 9:
            iVar29 = iVar29 + pSamplesOut[-9] * coefficients[9];
          case 8:
            iVar29 = iVar29 + pSamplesOut[-8] * coefficients[8];
          case 7:
            iVar29 = iVar29 + pSamplesOut[-7] * coefficients[7];
          case 6:
            iVar29 = iVar29 + pSamplesOut[-6] * coefficients[6];
          case 5:
            iVar29 = iVar29 + pSamplesOut[-5] * coefficients[5];
          case 4:
            iVar29 = iVar29 + pSamplesOut[-4] * coefficients[4];
          case 3:
            iVar29 = iVar29 + pSamplesOut[-3] * coefficients[3];
          case 2:
            iVar29 = iVar29 + pSamplesOut[-2] * coefficients[2];
          case 1:
            iVar29 = iVar29 + pSamplesOut[-1] * coefficients[1];
          case 0:
            iVar29 = iVar29 + *coefficients * iVar35;
          }
          iVar32 = (iVar29 >> (bVar10 & 0x1f)) + (uVar49 >> 1 ^ uVar43);
          pSamplesOut[1] = iVar32;
          iVar50 = 0;
          local_d8 = 0;
          local_d4 = 0;
          local_d0 = 0;
          local_cc = 0;
          local_c8 = 0;
          local_c4 = 0;
          local_c0 = 0;
          local_bc = 0;
          local_b8 = 0;
          local_b4 = 0;
          local_b0 = 0;
          local_ac = 0;
          local_a8 = 0;
          local_a4 = 0;
          iVar29 = 0;
          local_a0 = 0;
          iVar42 = 0;
          iVar15 = 0;
          iVar22 = 0;
          iVar34 = 0;
          iVar38 = 0;
          iVar44 = 0;
          iVar20 = 0;
          iVar26 = 0;
          iVar41 = 0;
          iVar28 = 0;
          iVar39 = 0;
          iVar51 = 0;
          iVar45 = 0;
          iVar33 = 0;
          iVar48 = 0;
          switch(iVar31) {
          case 0x1f:
            local_d8 = pSamplesOut[-0x1e] * coefficients[0x1f];
          case 0x1e:
            local_d4 = pSamplesOut[-0x1d] * coefficients[0x1e] + local_d8;
          case 0x1d:
            local_d0 = pSamplesOut[-0x1c] * coefficients[0x1d] + local_d4;
          case 0x1c:
            local_cc = pSamplesOut[-0x1b] * coefficients[0x1c] + local_d0;
          case 0x1b:
            local_c8 = pSamplesOut[-0x1a] * coefficients[0x1b] + local_cc;
          case 0x1a:
            local_c4 = pSamplesOut[-0x19] * coefficients[0x1a] + local_c8;
          case 0x19:
            local_c0 = pSamplesOut[-0x18] * coefficients[0x19] + local_c4;
          case 0x18:
            local_bc = pSamplesOut[-0x17] * coefficients[0x18] + local_c0;
          case 0x17:
            local_b8 = pSamplesOut[-0x16] * coefficients[0x17] + local_bc;
          case 0x16:
            local_b4 = pSamplesOut[-0x15] * coefficients[0x16] + local_b8;
          case 0x15:
            local_b0 = pSamplesOut[-0x14] * coefficients[0x15] + local_b4;
          case 0x14:
            local_ac = pSamplesOut[-0x13] * coefficients[0x14] + local_b0;
          case 0x13:
            local_a8 = pSamplesOut[-0x12] * coefficients[0x13] + local_ac;
          case 0x12:
            local_a4 = pSamplesOut[-0x11] * coefficients[0x12] + local_a8;
          case 0x11:
            iVar29 = pSamplesOut[-0x10] * coefficients[0x11] + local_a4;
          case 0x10:
            local_a0 = pSamplesOut[-0xf] * coefficients[0x10] + iVar29;
          case 0xf:
            iVar42 = pSamplesOut[-0xe] * coefficients[0xf] + local_a0;
          case 0xe:
            iVar15 = pSamplesOut[-0xd] * coefficients[0xe] + iVar42;
          case 0xd:
            iVar22 = pSamplesOut[-0xc] * coefficients[0xd] + iVar15;
          case 0xc:
            iVar34 = pSamplesOut[-0xb] * coefficients[0xc] + iVar22;
          case 0xb:
            iVar38 = pSamplesOut[-10] * coefficients[0xb] + iVar34;
          case 10:
            iVar44 = pSamplesOut[-9] * coefficients[10] + iVar38;
          case 9:
            iVar20 = pSamplesOut[-8] * coefficients[9] + iVar44;
          case 8:
            iVar26 = pSamplesOut[-7] * coefficients[8] + iVar20;
          case 7:
            iVar41 = pSamplesOut[-6] * coefficients[7] + iVar26;
          case 6:
            iVar28 = pSamplesOut[-5] * coefficients[6] + iVar41;
          case 5:
            iVar39 = pSamplesOut[-4] * coefficients[5] + iVar28;
          case 4:
            iVar51 = pSamplesOut[-3] * coefficients[4] + iVar39;
          case 3:
            iVar45 = pSamplesOut[-2] * coefficients[3] + iVar51;
          case 2:
            iVar33 = pSamplesOut[-1] * coefficients[2] + iVar45;
          case 1:
            iVar48 = coefficients[1] * iVar35 + iVar33;
          case 0:
            iVar50 = *coefficients * iVar32 + iVar48;
          }
          iVar29 = 0;
          iVar42 = (iVar50 >> (bVar10 & 0x1f)) + (uVar47 >> 1 ^ uVar27);
          pSamplesOut[2] = iVar42;
          switch(iVar31) {
          case 0x1f:
            iVar29 = pSamplesOut[-0x1d] * coefficients[0x1f];
          case 0x1e:
            iVar29 = iVar29 + pSamplesOut[-0x1c] * coefficients[0x1e];
          case 0x1d:
            iVar29 = iVar29 + pSamplesOut[-0x1b] * coefficients[0x1d];
          case 0x1c:
            iVar29 = iVar29 + pSamplesOut[-0x1a] * coefficients[0x1c];
          case 0x1b:
            iVar29 = iVar29 + pSamplesOut[-0x19] * coefficients[0x1b];
          case 0x1a:
            iVar29 = iVar29 + pSamplesOut[-0x18] * coefficients[0x1a];
          case 0x19:
            iVar29 = iVar29 + pSamplesOut[-0x17] * coefficients[0x19];
          case 0x18:
            iVar29 = iVar29 + pSamplesOut[-0x16] * coefficients[0x18];
          case 0x17:
            iVar29 = iVar29 + pSamplesOut[-0x15] * coefficients[0x17];
          case 0x16:
            iVar29 = iVar29 + pSamplesOut[-0x14] * coefficients[0x16];
          case 0x15:
            iVar29 = iVar29 + pSamplesOut[-0x13] * coefficients[0x15];
          case 0x14:
            iVar29 = iVar29 + pSamplesOut[-0x12] * coefficients[0x14];
          case 0x13:
            iVar29 = iVar29 + pSamplesOut[-0x11] * coefficients[0x13];
          case 0x12:
            iVar29 = iVar29 + pSamplesOut[-0x10] * coefficients[0x12];
          case 0x11:
            iVar29 = iVar29 + pSamplesOut[-0xf] * coefficients[0x11];
          case 0x10:
            iVar29 = iVar29 + pSamplesOut[-0xe] * coefficients[0x10];
          case 0xf:
            iVar29 = iVar29 + pSamplesOut[-0xd] * coefficients[0xf];
          case 0xe:
            iVar29 = iVar29 + pSamplesOut[-0xc] * coefficients[0xe];
          case 0xd:
            iVar29 = iVar29 + pSamplesOut[-0xb] * coefficients[0xd];
          case 0xc:
            iVar29 = iVar29 + pSamplesOut[-10] * coefficients[0xc];
          case 0xb:
            iVar29 = iVar29 + pSamplesOut[-9] * coefficients[0xb];
          case 10:
            iVar29 = iVar29 + pSamplesOut[-8] * coefficients[10];
          case 9:
            iVar29 = iVar29 + pSamplesOut[-7] * coefficients[9];
          case 8:
            iVar29 = iVar29 + pSamplesOut[-6] * coefficients[8];
          case 7:
            iVar29 = iVar29 + pSamplesOut[-5] * coefficients[7];
          case 6:
            iVar29 = iVar29 + pSamplesOut[-4] * coefficients[6];
          case 5:
            iVar29 = iVar29 + pSamplesOut[-3] * coefficients[5];
          case 4:
            iVar29 = iVar29 + pSamplesOut[-2] * coefficients[4];
          case 3:
            iVar29 = iVar29 + pSamplesOut[-1] * coefficients[3];
          case 2:
            iVar29 = iVar29 + iVar35 * coefficients[2];
          case 1:
            iVar29 = iVar29 + iVar32 * coefficients[1];
          case 0:
            iVar29 = iVar29 + iVar42 * *coefficients;
          }
          pSamplesOut[3] = (iVar29 >> (bVar10 & 0x1f)) + (uVar24 >> 1 ^ uVar17);
          pSamplesOut = pSamplesOut + 4;
        } while (pSamplesOut < piVar7);
      }
    }
    else if (uVar46 != 0) {
      iVar4 = riceParam + 1;
      uVar5 = 0x3f - riceParam;
      uVar8 = bs->cache;
      do {
        mVar23 = bs->consumedBits;
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (uVar8 != 0) {
            if (uVar8 < 0x1000000000000000) {
              bVar52 = uVar8 >> 0x20 == 0;
              uVar21 = uVar8 << 0x20;
              if (!bVar52) {
                uVar21 = uVar8;
              }
              iVar35 = (uint)bVar52 * 0x20;
              iVar29 = iVar35 + 0x10;
              uVar3 = uVar21 << 0x10;
              if (0xffffffffffff < uVar21) {
                iVar29 = iVar35;
                uVar3 = uVar21;
              }
              iVar35 = iVar29 + 8;
              uVar21 = uVar3 << 8;
              if (0xffffffffffffff < uVar3) {
                iVar35 = iVar29;
                uVar21 = uVar3;
              }
              iVar29 = iVar35 + 4;
              uVar3 = uVar21 << 4;
              if (0xfffffffffffffff < uVar21) {
                iVar29 = iVar35;
                uVar3 = uVar21;
              }
              iVar29 = iVar29 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                        (uVar3 >> 0x3c) * 4);
            }
            else {
              iVar29 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                               (uVar8 >> 0x3c) * 4);
            }
            uVar43 = iVar29 - 1;
            goto LAB_0016b2b8;
          }
LAB_0016b2c7:
          local_100 = 0x40 - mVar23;
          do {
            uVar43 = bs->nextL2Line;
            if ((ulong)uVar43 < 0x200) {
              uVar18 = bs->crc16;
              uVar27 = (uint)uVar18;
              if (bs->crc16CacheIgnoredBytes < 8) {
                mVar1 = bs->crc16Cache;
                uVar37 = (uint)mVar1;
                uVar2 = (ushort)(mVar1 >> 0x30);
                uVar24 = (uint)(mVar1 >> 0x10);
                uVar17 = (uint)(mVar1 >> 0x18);
                uVar25 = (uint)(mVar1 >> 0x20);
                switch(bs->crc16CacheIgnoredBytes) {
                case 0:
                  bs->crc16 = ma_dr_flac__crc16_table
                              [((uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [(uVar25 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar18 >> 8) ^
                                                       (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar2 ^
                                                      ((uint)uVar18 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar18 >> 8) ^
                                                             (uint)(byte)(mVar1 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar25 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar2 ^
                                                                              ((uint)uVar18 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar17 & 0xff] <<
                                8 ^ uVar37 ^
                               (uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar18 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar25 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar25 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar18 >> 8) ^
                                                              (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar18 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar18 >> 8) ^
                                                                    (uint)(byte)(mVar1 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar25 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar25 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar17 & 0xff]) >> 8 & 0xff ^ uVar24 & 0xffff) & 0xff]
                               ) >> 8 & 0xff] << 8 ^
                              ma_dr_flac__crc16_table
                              [(((uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar18 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff] << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uVar25 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [((uint)ma_dr_flac__crc16_table
                                                       [(uVar25 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar18 >> 8) ^
                                                                (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar18 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar25 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                uVar17 & 0xff]) >> 8 & 0xff ^ uVar24 & 0xffff) &
                                        0xff] << 8 ^
                                (uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [((uint)ma_dr_flac__crc16_table
                                                      [(uVar25 >> 8 ^
                                                       ((uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar18 >> 8) ^
                                                               (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar18 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                       0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar18 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar25 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                               uVar17 & 0xff] << 8 ^ uVar37 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(((uint)ma_dr_flac__crc16_table
                                                      [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar25 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar25 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar25 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar17 & 0xff]) >> 8 & 0xff ^ uVar24 & 0xffff) &
                                              0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar37) & 0xff];
                  break;
                case 1:
                  uVar27 = (uint)(ushort)(uVar18 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)(uVar2 ^ uVar18 >> 8) & 0xff]);
                case 2:
                  uVar27 = (uint)(ushort)((ushort)(uVar27 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar25 ^ uVar27) >> 8 & 0xff]);
                case 3:
                  uVar27 = (uint)(ushort)((ushort)(uVar27 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar25 ^ uVar27 >> 8) & 0xff]);
                case 4:
                  uVar27 = (uint)(ushort)((ushort)(uVar27 << 8) ^
                                         ma_dr_flac__crc16_table[uVar27 >> 8 ^ uVar17 & 0xff]);
                case 5:
                  uVar27 = (uint)(ushort)((ushort)(uVar27 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar27 >> 8 ^ uVar24 & 0xffff) & 0xff]);
                case 6:
                  uVar18 = (ushort)(uVar27 << 8) ^
                           ma_dr_flac__crc16_table[(uVar37 ^ uVar27) >> 8 & 0xff];
                case 7:
                  uVar18 = uVar18 << 8 ^ ma_dr_flac__crc16_table[(uVar37 ^ uVar18 >> 8) & 0xff];
                  goto LAB_0016b4bc;
                }
              }
              else {
LAB_0016b4bc:
                bs->crc16 = uVar18;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar43 + 1;
              uVar8 = bs->cacheL2[uVar43];
              uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                      (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                      (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                      (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
              bs->crc16Cache = uVar8;
              mVar23 = 0;
            }
            else {
              mVar6 = ma_dr_flac__reload_cache(bs);
              if (mVar6 == 0) {
                return 0;
              }
              uVar8 = bs->cache;
              mVar23 = bs->consumedBits;
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              if (uVar8 == 0) {
                uVar43 = 0x40;
              }
              else {
                if (uVar8 < 0x1000000000000000) {
                  bVar52 = uVar8 >> 0x20 == 0;
                  uVar21 = uVar8 << 0x20;
                  if (!bVar52) {
                    uVar21 = uVar8;
                  }
                  iVar35 = (uint)bVar52 * 0x20;
                  iVar29 = iVar35 + 0x10;
                  uVar3 = uVar21 << 0x10;
                  if (0xffffffffffff < uVar21) {
                    iVar29 = iVar35;
                    uVar3 = uVar21;
                  }
                  iVar35 = iVar29 + 8;
                  uVar21 = uVar3 << 8;
                  if (0xffffffffffffff < uVar3) {
                    iVar35 = iVar29;
                    uVar21 = uVar3;
                  }
                  iVar29 = iVar35 + 4;
                  uVar3 = uVar21 << 4;
                  if (0xfffffffffffffff < uVar21) {
                    iVar29 = iVar35;
                    uVar3 = uVar21;
                  }
                  iVar29 = iVar29 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                             clz_table_4 + (uVar3 >> 0x3c) * 4);
                }
                else {
                  iVar29 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                   (uVar8 >> 0x3c) * 4);
                }
                uVar43 = iVar29 - 1;
              }
            }
            else {
              uVar43 = (uint)LZCOUNT(uVar8);
            }
            local_100 = local_100 + uVar43;
          } while (0x3f < uVar43);
        }
        else {
          uVar43 = (uint)LZCOUNT(uVar8);
LAB_0016b2b8:
          local_100 = uVar43;
          if (0x3f < uVar43) goto LAB_0016b2c7;
        }
        uVar8 = uVar8 << ((byte)uVar43 & 0x3f);
        uVar43 = mVar23 + uVar43;
        bVar11 = (byte)uVar5;
        local_f8 = (uint)(uVar8 >> (bVar11 & 0x3f));
        bVar12 = (byte)iVar4;
        if (uVar5 < uVar43) {
          uVar43 = uVar43 - uVar5;
          uVar27 = bs->nextL2Line;
          if ((ulong)uVar27 < 0x200) {
            uVar18 = bs->crc16;
            uVar17 = (uint)uVar18;
            if (bs->crc16CacheIgnoredBytes < 8) {
              mVar1 = bs->crc16Cache;
              uVar19 = (uint)mVar1;
              uVar2 = (ushort)(mVar1 >> 0x30);
              uVar25 = (uint)(mVar1 >> 0x10);
              uVar24 = (uint)(mVar1 >> 0x18);
              uVar37 = (uint)(mVar1 >> 0x20);
              switch(bs->crc16CacheIgnoredBytes) {
              case 0:
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar37 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar18 >> 8) ^
                                                     (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar2 ^
                                                    ((uint)uVar18 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar18 >> 8) ^
                                                           (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff
                                                    ) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar18 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar37 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar24 & 0xff] <<
                              8 ^ uVar19 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar18 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar37 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar37 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar18 >> 8) ^
                                                            (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar2 ^
                                                           ((uint)uVar18 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar18 >> 8) ^
                                                                  (uint)(byte)(mVar1 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] <<
                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                       [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar18 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            uVar24 & 0xff]) >> 8 & 0xff ^ uVar25 & 0xffff) & 0xff])
                             >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar18 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar37 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar37 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar18 >> 8) ^
                                                              (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar18 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar18 >> 8) ^
                                                                    (uint)(byte)(mVar1 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar37 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar24 & 0xff]) >> 8 & 0xff ^ uVar25 & 0xffff) & 0xff]
                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [((uint)ma_dr_flac__crc16_table
                                                            [(uVar37 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar24 & 0xff] << 8 ^ uVar19 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [(((uint)ma_dr_flac__crc16_table
                                                            [(uVar37 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar37 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar18 >> 8) ^
                                                                         (uint)(byte)(mVar1 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar18 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar24 & 0xff]) >> 8 & 0xff ^ uVar25 & 0xffff) &
                                                  0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar19) & 0xff]
                ;
                break;
              case 1:
                uVar17 = (uint)(ushort)(uVar18 << 8 ^
                                       ma_dr_flac__crc16_table[(ushort)(uVar2 ^ uVar18 >> 8) & 0xff]
                                       );
              case 2:
                uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar37 ^ uVar17) >> 8 & 0xff]);
              case 3:
                uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar37 ^ uVar17 >> 8) & 0xff]);
              case 4:
                uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                       ma_dr_flac__crc16_table[uVar17 >> 8 ^ uVar24 & 0xff]);
              case 5:
                uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                       ma_dr_flac__crc16_table
                                       [(uVar17 >> 8 ^ uVar25 & 0xffff) & 0xff]);
              case 6:
                uVar18 = (ushort)(uVar17 << 8) ^
                         ma_dr_flac__crc16_table[(uVar19 ^ uVar17) >> 8 & 0xff];
              case 7:
                uVar18 = uVar18 << 8 ^ ma_dr_flac__crc16_table[(uVar19 ^ uVar18 >> 8) & 0xff];
                goto LAB_0016b7f9;
              }
            }
            else {
LAB_0016b7f9:
              bs->crc16 = uVar18;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar27 + 1;
            uVar8 = bs->cacheL2[uVar27];
            uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                    (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                    (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                    (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
            bs->crc16Cache = uVar8;
            mVar23 = uVar43;
          }
          else {
            mVar6 = ma_dr_flac__reload_cache(bs);
            if (mVar6 == 0) {
              return 0;
            }
            if (0x40 - (ulong)bs->consumedBits < (ulong)uVar43) {
              return 0;
            }
            uVar8 = bs->cache;
            mVar23 = bs->consumedBits + uVar43;
          }
          local_f8 = local_f8 | (uint)(uVar8 >> (-(byte)uVar43 & 0x3f));
          uVar8 = uVar8 << ((byte)uVar43 & 0x3f);
        }
        else {
          uVar8 = uVar8 << (bVar12 & 0x3f);
          mVar23 = uVar43 + iVar4;
        }
        bs->cache = uVar8;
        bs->consumedBits = mVar23;
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (uVar8 != 0) {
            if (uVar8 < 0x1000000000000000) {
              bVar52 = uVar8 >> 0x20 == 0;
              uVar21 = uVar8 << 0x20;
              if (!bVar52) {
                uVar21 = uVar8;
              }
              iVar35 = (uint)bVar52 * 0x20;
              iVar29 = iVar35 + 0x10;
              uVar3 = uVar21 << 0x10;
              if (0xffffffffffff < uVar21) {
                iVar29 = iVar35;
                uVar3 = uVar21;
              }
              iVar35 = iVar29 + 8;
              uVar21 = uVar3 << 8;
              if (0xffffffffffffff < uVar3) {
                iVar35 = iVar29;
                uVar21 = uVar3;
              }
              iVar29 = iVar35 + 4;
              uVar3 = uVar21 << 4;
              if (0xfffffffffffffff < uVar21) {
                iVar29 = iVar35;
                uVar3 = uVar21;
              }
              iVar29 = iVar29 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                        (uVar3 >> 0x3c) * 4);
            }
            else {
              iVar29 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                               (uVar8 >> 0x3c) * 4);
            }
            uVar43 = iVar29 - 1;
            goto LAB_0016b902;
          }
LAB_0016b910:
          uVar27 = 0x40 - mVar23;
          do {
            uVar43 = bs->nextL2Line;
            if ((ulong)uVar43 < 0x200) {
              uVar18 = bs->crc16;
              uVar17 = (uint)uVar18;
              if (bs->crc16CacheIgnoredBytes < 8) {
                mVar1 = bs->crc16Cache;
                uVar19 = (uint)mVar1;
                uVar2 = (ushort)(mVar1 >> 0x30);
                uVar25 = (uint)(mVar1 >> 0x10);
                uVar24 = (uint)(mVar1 >> 0x18);
                uVar37 = (uint)(mVar1 >> 0x20);
                switch(bs->crc16CacheIgnoredBytes) {
                case 0:
                  bs->crc16 = ma_dr_flac__crc16_table
                              [((uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [(uVar37 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar18 >> 8) ^
                                                       (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar2 ^
                                                      ((uint)uVar18 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar18 >> 8) ^
                                                             (uint)(byte)(mVar1 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar37 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar2 ^
                                                                              ((uint)uVar18 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar24 & 0xff] <<
                                8 ^ uVar19 ^
                               (uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar18 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar37 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar37 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar18 >> 8) ^
                                                              (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar18 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar18 >> 8) ^
                                                                    (uint)(byte)(mVar1 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar37 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar24 & 0xff]) >> 8 & 0xff ^ uVar25 & 0xffff) & 0xff]
                               ) >> 8 & 0xff] << 8 ^
                              ma_dr_flac__crc16_table
                              [(((uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar18 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff] << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uVar37 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [((uint)ma_dr_flac__crc16_table
                                                       [(uVar37 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar18 >> 8) ^
                                                                (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar18 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                uVar24 & 0xff]) >> 8 & 0xff ^ uVar25 & 0xffff) &
                                        0xff] << 8 ^
                                (uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [((uint)ma_dr_flac__crc16_table
                                                      [(uVar37 >> 8 ^
                                                       ((uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar18 >> 8) ^
                                                               (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar18 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                       0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar18 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                               uVar24 & 0xff] << 8 ^ uVar19 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(((uint)ma_dr_flac__crc16_table
                                                      [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar37 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar37 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar37 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar24 & 0xff]) >> 8 & 0xff ^ uVar25 & 0xffff) &
                                              0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar19) & 0xff];
                  break;
                case 1:
                  uVar17 = (uint)(ushort)(uVar18 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)(uVar2 ^ uVar18 >> 8) & 0xff]);
                case 2:
                  uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar37 ^ uVar17) >> 8 & 0xff]);
                case 3:
                  uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar37 ^ uVar17 >> 8) & 0xff]);
                case 4:
                  uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                         ma_dr_flac__crc16_table[uVar17 >> 8 ^ uVar24 & 0xff]);
                case 5:
                  uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar17 >> 8 ^ uVar25 & 0xffff) & 0xff]);
                case 6:
                  uVar18 = (ushort)(uVar17 << 8) ^
                           ma_dr_flac__crc16_table[(uVar19 ^ uVar17) >> 8 & 0xff];
                case 7:
                  uVar18 = uVar18 << 8 ^ ma_dr_flac__crc16_table[(uVar19 ^ uVar18 >> 8) & 0xff];
                  goto LAB_0016bb01;
                }
              }
              else {
LAB_0016bb01:
                bs->crc16 = uVar18;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar43 + 1;
              uVar8 = bs->cacheL2[uVar43];
              uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                      (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                      (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                      (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
              bs->crc16Cache = uVar8;
              mVar23 = 0;
            }
            else {
              mVar6 = ma_dr_flac__reload_cache(bs);
              if (mVar6 == 0) {
                return 0;
              }
              uVar8 = bs->cache;
              mVar23 = bs->consumedBits;
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              if (uVar8 == 0) {
                uVar43 = 0x40;
              }
              else {
                if (uVar8 < 0x1000000000000000) {
                  bVar52 = uVar8 >> 0x20 == 0;
                  uVar21 = uVar8 << 0x20;
                  if (!bVar52) {
                    uVar21 = uVar8;
                  }
                  iVar35 = (uint)bVar52 * 0x20;
                  iVar29 = iVar35 + 0x10;
                  uVar3 = uVar21 << 0x10;
                  if (0xffffffffffff < uVar21) {
                    iVar29 = iVar35;
                    uVar3 = uVar21;
                  }
                  iVar35 = iVar29 + 8;
                  uVar21 = uVar3 << 8;
                  if (0xffffffffffffff < uVar3) {
                    iVar35 = iVar29;
                    uVar21 = uVar3;
                  }
                  iVar29 = iVar35 + 4;
                  uVar3 = uVar21 << 4;
                  if (0xfffffffffffffff < uVar21) {
                    iVar29 = iVar35;
                    uVar3 = uVar21;
                  }
                  iVar29 = iVar29 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                             clz_table_4 + (uVar3 >> 0x3c) * 4);
                }
                else {
                  iVar29 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                   (uVar8 >> 0x3c) * 4);
                }
                uVar43 = iVar29 - 1;
              }
            }
            else {
              uVar43 = (uint)LZCOUNT(uVar8);
            }
            uVar27 = uVar27 + uVar43;
          } while (0x3f < uVar43);
        }
        else {
          uVar43 = (uint)LZCOUNT(uVar8);
LAB_0016b902:
          uVar27 = uVar43;
          if (0x3f < uVar43) goto LAB_0016b910;
        }
        uVar8 = uVar8 << ((byte)uVar43 & 0x3f);
        uVar43 = mVar23 + uVar43;
        local_f0 = (uint)(uVar8 >> (bVar11 & 0x3f));
        if (uVar5 < uVar43) {
          uVar43 = uVar43 - uVar5;
          uVar17 = bs->nextL2Line;
          if ((ulong)uVar17 < 0x200) {
            uVar18 = bs->crc16;
            uVar24 = (uint)uVar18;
            if (bs->crc16CacheIgnoredBytes < 8) {
              mVar1 = bs->crc16Cache;
              uVar47 = (uint)mVar1;
              uVar2 = (ushort)(mVar1 >> 0x30);
              uVar37 = (uint)(mVar1 >> 0x10);
              uVar25 = (uint)(mVar1 >> 0x18);
              uVar19 = (uint)(mVar1 >> 0x20);
              switch(bs->crc16CacheIgnoredBytes) {
              case 0:
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar19 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar18 >> 8) ^
                                                     (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar2 ^
                                                    ((uint)uVar18 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar18 >> 8) ^
                                                           (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff
                                                    ) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar18 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar19 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar25 & 0xff] <<
                              8 ^ uVar47 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar18 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar19 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar19 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar18 >> 8) ^
                                                            (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar2 ^
                                                           ((uint)uVar18 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar18 >> 8) ^
                                                                  (uint)(byte)(mVar1 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] <<
                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                       [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar18 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            uVar25 & 0xff]) >> 8 & 0xff ^ uVar37 & 0xffff) & 0xff])
                             >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar18 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar19 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar19 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar18 >> 8) ^
                                                              (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar18 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar18 >> 8) ^
                                                                    (uint)(byte)(mVar1 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar19 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar25 & 0xff]) >> 8 & 0xff ^ uVar37 & 0xffff) & 0xff]
                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [((uint)ma_dr_flac__crc16_table
                                                            [(uVar19 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar25 & 0xff] << 8 ^ uVar47 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [(((uint)ma_dr_flac__crc16_table
                                                            [(uVar19 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar19 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar18 >> 8) ^
                                                                         (uint)(byte)(mVar1 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar18 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar25 & 0xff]) >> 8 & 0xff ^ uVar37 & 0xffff) &
                                                  0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar47) & 0xff]
                ;
                break;
              case 1:
                uVar24 = (uint)(ushort)(uVar18 << 8 ^
                                       ma_dr_flac__crc16_table[(ushort)(uVar2 ^ uVar18 >> 8) & 0xff]
                                       );
              case 2:
                uVar24 = (uint)(ushort)((ushort)(uVar24 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar19 ^ uVar24) >> 8 & 0xff]);
              case 3:
                uVar24 = (uint)(ushort)((ushort)(uVar24 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar19 ^ uVar24 >> 8) & 0xff]);
              case 4:
                uVar24 = (uint)(ushort)((ushort)(uVar24 << 8) ^
                                       ma_dr_flac__crc16_table[uVar24 >> 8 ^ uVar25 & 0xff]);
              case 5:
                uVar24 = (uint)(ushort)((ushort)(uVar24 << 8) ^
                                       ma_dr_flac__crc16_table
                                       [(uVar24 >> 8 ^ uVar37 & 0xffff) & 0xff]);
              case 6:
                uVar18 = (ushort)(uVar24 << 8) ^
                         ma_dr_flac__crc16_table[(uVar47 ^ uVar24) >> 8 & 0xff];
              case 7:
                uVar18 = uVar18 << 8 ^ ma_dr_flac__crc16_table[(uVar47 ^ uVar18 >> 8) & 0xff];
                goto LAB_0016be35;
              }
            }
            else {
LAB_0016be35:
              bs->crc16 = uVar18;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar17 + 1;
            uVar8 = bs->cacheL2[uVar17];
            uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                    (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                    (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                    (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
            bs->crc16Cache = uVar8;
            mVar23 = uVar43;
          }
          else {
            mVar6 = ma_dr_flac__reload_cache(bs);
            if (mVar6 == 0) {
              return 0;
            }
            if (0x40 - (ulong)bs->consumedBits < (ulong)uVar43) {
              return 0;
            }
            uVar8 = bs->cache;
            mVar23 = bs->consumedBits + uVar43;
          }
          local_f0 = local_f0 | (uint)(uVar8 >> (-(byte)uVar43 & 0x3f));
          uVar8 = uVar8 << ((byte)uVar43 & 0x3f);
        }
        else {
          uVar8 = uVar8 << (bVar12 & 0x3f);
          mVar23 = uVar43 + iVar4;
        }
        bs->cache = uVar8;
        bs->consumedBits = mVar23;
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (uVar8 != 0) {
            if (uVar8 < 0x1000000000000000) {
              bVar52 = uVar8 >> 0x20 == 0;
              uVar21 = uVar8 << 0x20;
              if (!bVar52) {
                uVar21 = uVar8;
              }
              iVar35 = (uint)bVar52 * 0x20;
              iVar29 = iVar35 + 0x10;
              uVar3 = uVar21 << 0x10;
              if (0xffffffffffff < uVar21) {
                iVar29 = iVar35;
                uVar3 = uVar21;
              }
              iVar35 = iVar29 + 8;
              uVar21 = uVar3 << 8;
              if (0xffffffffffffff < uVar3) {
                iVar35 = iVar29;
                uVar21 = uVar3;
              }
              iVar29 = iVar35 + 4;
              uVar3 = uVar21 << 4;
              if (0xfffffffffffffff < uVar21) {
                iVar29 = iVar35;
                uVar3 = uVar21;
              }
              iVar29 = iVar29 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                        (uVar3 >> 0x3c) * 4);
            }
            else {
              iVar29 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                               (uVar8 >> 0x3c) * 4);
            }
            uVar43 = iVar29 - 1;
            goto LAB_0016bf3e;
          }
LAB_0016bf4c:
          uVar17 = 0x40 - mVar23;
          do {
            uVar43 = bs->nextL2Line;
            if ((ulong)uVar43 < 0x200) {
              uVar18 = bs->crc16;
              uVar24 = (uint)uVar18;
              if (bs->crc16CacheIgnoredBytes < 8) {
                mVar1 = bs->crc16Cache;
                uVar47 = (uint)mVar1;
                uVar2 = (ushort)(mVar1 >> 0x30);
                uVar37 = (uint)(mVar1 >> 0x10);
                uVar25 = (uint)(mVar1 >> 0x18);
                uVar19 = (uint)(mVar1 >> 0x20);
                switch(bs->crc16CacheIgnoredBytes) {
                case 0:
                  bs->crc16 = ma_dr_flac__crc16_table
                              [((uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [(uVar19 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar18 >> 8) ^
                                                       (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar2 ^
                                                      ((uint)uVar18 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar18 >> 8) ^
                                                             (uint)(byte)(mVar1 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar19 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar2 ^
                                                                              ((uint)uVar18 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar25 & 0xff] <<
                                8 ^ uVar47 ^
                               (uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar18 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar19 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar19 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar18 >> 8) ^
                                                              (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar18 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar18 >> 8) ^
                                                                    (uint)(byte)(mVar1 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar19 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar25 & 0xff]) >> 8 & 0xff ^ uVar37 & 0xffff) & 0xff]
                               ) >> 8 & 0xff] << 8 ^
                              ma_dr_flac__crc16_table
                              [(((uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar18 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff] << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uVar19 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [((uint)ma_dr_flac__crc16_table
                                                       [(uVar19 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar18 >> 8) ^
                                                                (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar18 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                uVar25 & 0xff]) >> 8 & 0xff ^ uVar37 & 0xffff) &
                                        0xff] << 8 ^
                                (uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [((uint)ma_dr_flac__crc16_table
                                                      [(uVar19 >> 8 ^
                                                       ((uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar18 >> 8) ^
                                                               (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar18 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                       0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar18 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                               uVar25 & 0xff] << 8 ^ uVar47 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(((uint)ma_dr_flac__crc16_table
                                                      [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar19 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar25 & 0xff]) >> 8 & 0xff ^ uVar37 & 0xffff) &
                                              0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar47) & 0xff];
                  break;
                case 1:
                  uVar24 = (uint)(ushort)(uVar18 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)(uVar2 ^ uVar18 >> 8) & 0xff]);
                case 2:
                  uVar24 = (uint)(ushort)((ushort)(uVar24 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar19 ^ uVar24) >> 8 & 0xff]);
                case 3:
                  uVar24 = (uint)(ushort)((ushort)(uVar24 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar19 ^ uVar24 >> 8) & 0xff]);
                case 4:
                  uVar24 = (uint)(ushort)((ushort)(uVar24 << 8) ^
                                         ma_dr_flac__crc16_table[uVar24 >> 8 ^ uVar25 & 0xff]);
                case 5:
                  uVar24 = (uint)(ushort)((ushort)(uVar24 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar24 >> 8 ^ uVar37 & 0xffff) & 0xff]);
                case 6:
                  uVar18 = (ushort)(uVar24 << 8) ^
                           ma_dr_flac__crc16_table[(uVar47 ^ uVar24) >> 8 & 0xff];
                case 7:
                  uVar18 = uVar18 << 8 ^ ma_dr_flac__crc16_table[(uVar47 ^ uVar18 >> 8) & 0xff];
                  goto LAB_0016c13d;
                }
              }
              else {
LAB_0016c13d:
                bs->crc16 = uVar18;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar43 + 1;
              uVar8 = bs->cacheL2[uVar43];
              uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                      (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                      (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                      (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
              bs->crc16Cache = uVar8;
              mVar23 = 0;
            }
            else {
              mVar6 = ma_dr_flac__reload_cache(bs);
              if (mVar6 == 0) {
                return 0;
              }
              uVar8 = bs->cache;
              mVar23 = bs->consumedBits;
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              if (uVar8 == 0) {
                uVar43 = 0x40;
              }
              else {
                if (uVar8 < 0x1000000000000000) {
                  bVar52 = uVar8 >> 0x20 == 0;
                  uVar21 = uVar8 << 0x20;
                  if (!bVar52) {
                    uVar21 = uVar8;
                  }
                  iVar35 = (uint)bVar52 * 0x20;
                  iVar29 = iVar35 + 0x10;
                  uVar3 = uVar21 << 0x10;
                  if (0xffffffffffff < uVar21) {
                    iVar29 = iVar35;
                    uVar3 = uVar21;
                  }
                  iVar35 = iVar29 + 8;
                  uVar21 = uVar3 << 8;
                  if (0xffffffffffffff < uVar3) {
                    iVar35 = iVar29;
                    uVar21 = uVar3;
                  }
                  iVar29 = iVar35 + 4;
                  uVar3 = uVar21 << 4;
                  if (0xfffffffffffffff < uVar21) {
                    iVar29 = iVar35;
                    uVar3 = uVar21;
                  }
                  iVar29 = iVar29 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                             clz_table_4 + (uVar3 >> 0x3c) * 4);
                }
                else {
                  iVar29 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                   (uVar8 >> 0x3c) * 4);
                }
                uVar43 = iVar29 - 1;
              }
            }
            else {
              uVar43 = (uint)LZCOUNT(uVar8);
            }
            uVar17 = uVar17 + uVar43;
          } while (0x3f < uVar43);
        }
        else {
          uVar43 = (uint)LZCOUNT(uVar8);
LAB_0016bf3e:
          uVar17 = uVar43;
          if (0x3f < uVar43) goto LAB_0016bf4c;
        }
        uVar8 = uVar8 << ((byte)uVar43 & 0x3f);
        uVar43 = mVar23 + uVar43;
        local_98 = (uint)(uVar8 >> (bVar11 & 0x3f));
        if (uVar5 < uVar43) {
          uVar43 = uVar43 - uVar5;
          uVar24 = bs->nextL2Line;
          if ((ulong)uVar24 < 0x200) {
            uVar18 = bs->crc16;
            uVar25 = (uint)uVar18;
            if (bs->crc16CacheIgnoredBytes < 8) {
              mVar1 = bs->crc16Cache;
              uVar49 = (uint)mVar1;
              uVar2 = (ushort)(mVar1 >> 0x30);
              uVar19 = (uint)(mVar1 >> 0x10);
              uVar37 = (uint)(mVar1 >> 0x18);
              uVar47 = (uint)(mVar1 >> 0x20);
              switch(bs->crc16CacheIgnoredBytes) {
              case 0:
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar47 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar18 >> 8) ^
                                                     (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar2 ^
                                                    ((uint)uVar18 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar18 >> 8) ^
                                                           (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff
                                                    ) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar47 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar18 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar47 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar37 & 0xff] <<
                              8 ^ uVar49 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar47 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar18 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar47 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar47 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar18 >> 8) ^
                                                            (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar2 ^
                                                           ((uint)uVar18 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar18 >> 8) ^
                                                                  (uint)(byte)(mVar1 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] <<
                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                       [(uVar47 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar18 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar47 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            uVar37 & 0xff]) >> 8 & 0xff ^ uVar19 & 0xffff) & 0xff])
                             >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar47 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar18 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar47 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar47 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar18 >> 8) ^
                                                              (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar18 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar18 >> 8) ^
                                                                    (uint)(byte)(mVar1 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar47 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar47 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar37 & 0xff]) >> 8 & 0xff ^ uVar19 & 0xffff) & 0xff]
                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [((uint)ma_dr_flac__crc16_table
                                                            [(uVar47 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar47 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar47 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar37 & 0xff] << 8 ^ uVar49 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [(((uint)ma_dr_flac__crc16_table
                                                            [(uVar47 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar47 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar47 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar18 >> 8) ^
                                                                         (uint)(byte)(mVar1 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar18 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar47 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar47 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar37 & 0xff]) >> 8 & 0xff ^ uVar19 & 0xffff) &
                                                  0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar49) & 0xff]
                ;
                break;
              case 1:
                uVar25 = (uint)(ushort)(uVar18 << 8 ^
                                       ma_dr_flac__crc16_table[(ushort)(uVar2 ^ uVar18 >> 8) & 0xff]
                                       );
              case 2:
                uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar47 ^ uVar25) >> 8 & 0xff]);
              case 3:
                uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar47 ^ uVar25 >> 8) & 0xff]);
              case 4:
                uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                       ma_dr_flac__crc16_table[uVar25 >> 8 ^ uVar37 & 0xff]);
              case 5:
                uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                       ma_dr_flac__crc16_table
                                       [(uVar25 >> 8 ^ uVar19 & 0xffff) & 0xff]);
              case 6:
                uVar18 = (ushort)(uVar25 << 8) ^
                         ma_dr_flac__crc16_table[(uVar49 ^ uVar25) >> 8 & 0xff];
              case 7:
                uVar18 = uVar18 << 8 ^ ma_dr_flac__crc16_table[(uVar49 ^ uVar18 >> 8) & 0xff];
                goto LAB_0016c471;
              }
            }
            else {
LAB_0016c471:
              bs->crc16 = uVar18;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar24 + 1;
            uVar8 = bs->cacheL2[uVar24];
            uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                    (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                    (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                    (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
            bs->crc16Cache = uVar8;
            mVar23 = uVar43;
          }
          else {
            mVar6 = ma_dr_flac__reload_cache(bs);
            if (mVar6 == 0) {
              return 0;
            }
            if (0x40 - (ulong)bs->consumedBits < (ulong)uVar43) {
              return 0;
            }
            uVar8 = bs->cache;
            mVar23 = bs->consumedBits + uVar43;
          }
          local_98 = local_98 | (uint)(uVar8 >> (-(byte)uVar43 & 0x3f));
          uVar8 = uVar8 << ((byte)uVar43 & 0x3f);
        }
        else {
          uVar8 = uVar8 << (bVar12 & 0x3f);
          mVar23 = uVar43 + iVar4;
        }
        bs->cache = uVar8;
        bs->consumedBits = mVar23;
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (uVar8 != 0) {
            if (uVar8 < 0x1000000000000000) {
              bVar52 = uVar8 >> 0x20 == 0;
              uVar21 = uVar8 << 0x20;
              if (!bVar52) {
                uVar21 = uVar8;
              }
              iVar35 = (uint)bVar52 * 0x20;
              iVar29 = iVar35 + 0x10;
              uVar3 = uVar21 << 0x10;
              if (0xffffffffffff < uVar21) {
                iVar29 = iVar35;
                uVar3 = uVar21;
              }
              iVar35 = iVar29 + 8;
              uVar21 = uVar3 << 8;
              if (0xffffffffffffff < uVar3) {
                iVar35 = iVar29;
                uVar21 = uVar3;
              }
              iVar29 = iVar35 + 4;
              uVar3 = uVar21 << 4;
              if (0xfffffffffffffff < uVar21) {
                iVar29 = iVar35;
                uVar3 = uVar21;
              }
              iVar29 = iVar29 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                        (uVar3 >> 0x3c) * 4);
            }
            else {
              iVar29 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                               (uVar8 >> 0x3c) * 4);
            }
            uVar43 = iVar29 - 1;
            goto LAB_0016c579;
          }
LAB_0016c585:
          uVar24 = 0x40 - mVar23;
          do {
            uVar43 = bs->nextL2Line;
            if ((ulong)uVar43 < 0x200) {
              uVar18 = bs->crc16;
              uVar25 = (uint)uVar18;
              if (bs->crc16CacheIgnoredBytes < 8) {
                mVar1 = bs->crc16Cache;
                uVar49 = (uint)mVar1;
                uVar2 = (ushort)(mVar1 >> 0x30);
                uVar19 = (uint)(mVar1 >> 0x10);
                uVar37 = (uint)(mVar1 >> 0x18);
                uVar47 = (uint)(mVar1 >> 0x20);
                switch(bs->crc16CacheIgnoredBytes) {
                case 0:
                  bs->crc16 = ma_dr_flac__crc16_table
                              [((uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [(uVar47 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar18 >> 8) ^
                                                       (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar2 ^
                                                      ((uint)uVar18 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar18 >> 8) ^
                                                             (uint)(byte)(mVar1 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uVar47 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar47 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar2 ^
                                                                              ((uint)uVar18 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar37 & 0xff] <<
                                8 ^ uVar49 ^
                               (uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar47 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar18 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar47 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar47 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar18 >> 8) ^
                                                              (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar18 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar18 >> 8) ^
                                                                    (uint)(byte)(mVar1 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar47 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar47 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar37 & 0xff]) >> 8 & 0xff ^ uVar19 & 0xffff) & 0xff]
                               ) >> 8 & 0xff] << 8 ^
                              ma_dr_flac__crc16_table
                              [(((uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar47 ^ ((uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar18 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff] << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uVar47 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [((uint)ma_dr_flac__crc16_table
                                                       [(uVar47 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar18 >> 8) ^
                                                                (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar18 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar47 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar47 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                uVar37 & 0xff]) >> 8 & 0xff ^ uVar19 & 0xffff) &
                                        0xff] << 8 ^
                                (uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [((uint)ma_dr_flac__crc16_table
                                                      [(uVar47 >> 8 ^
                                                       ((uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar18 >> 8) ^
                                                               (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar18 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                       0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar47 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar18 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar47 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                               uVar37 & 0xff] << 8 ^ uVar49 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(((uint)ma_dr_flac__crc16_table
                                                      [(uVar47 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar47 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar47 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar47 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar47 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar37 & 0xff]) >> 8 & 0xff ^ uVar19 & 0xffff) &
                                              0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar49) & 0xff];
                  break;
                case 1:
                  uVar25 = (uint)(ushort)(uVar18 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)(uVar2 ^ uVar18 >> 8) & 0xff]);
                case 2:
                  uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar47 ^ uVar25) >> 8 & 0xff]);
                case 3:
                  uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar47 ^ uVar25 >> 8) & 0xff]);
                case 4:
                  uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                         ma_dr_flac__crc16_table[uVar25 >> 8 ^ uVar37 & 0xff]);
                case 5:
                  uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar25 >> 8 ^ uVar19 & 0xffff) & 0xff]);
                case 6:
                  uVar18 = (ushort)(uVar25 << 8) ^
                           ma_dr_flac__crc16_table[(uVar49 ^ uVar25) >> 8 & 0xff];
                case 7:
                  uVar18 = uVar18 << 8 ^ ma_dr_flac__crc16_table[(uVar49 ^ uVar18 >> 8) & 0xff];
                  goto LAB_0016c775;
                }
              }
              else {
LAB_0016c775:
                bs->crc16 = uVar18;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar43 + 1;
              uVar8 = bs->cacheL2[uVar43];
              uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                      (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                      (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                      (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
              bs->crc16Cache = uVar8;
              mVar23 = 0;
            }
            else {
              mVar6 = ma_dr_flac__reload_cache(bs);
              if (mVar6 == 0) {
                return 0;
              }
              uVar8 = bs->cache;
              mVar23 = bs->consumedBits;
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              if (uVar8 == 0) {
                uVar43 = 0x40;
              }
              else {
                if (uVar8 < 0x1000000000000000) {
                  bVar52 = uVar8 >> 0x20 == 0;
                  uVar21 = uVar8 << 0x20;
                  if (!bVar52) {
                    uVar21 = uVar8;
                  }
                  iVar35 = (uint)bVar52 * 0x20;
                  iVar29 = iVar35 + 0x10;
                  uVar3 = uVar21 << 0x10;
                  if (0xffffffffffff < uVar21) {
                    iVar29 = iVar35;
                    uVar3 = uVar21;
                  }
                  iVar35 = iVar29 + 8;
                  uVar21 = uVar3 << 8;
                  if (0xffffffffffffff < uVar3) {
                    iVar35 = iVar29;
                    uVar21 = uVar3;
                  }
                  iVar29 = iVar35 + 4;
                  uVar3 = uVar21 << 4;
                  if (0xfffffffffffffff < uVar21) {
                    iVar29 = iVar35;
                    uVar3 = uVar21;
                  }
                  iVar29 = iVar29 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                             clz_table_4 + (uVar3 >> 0x3c) * 4);
                }
                else {
                  iVar29 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                   (uVar8 >> 0x3c) * 4);
                }
                uVar43 = iVar29 - 1;
              }
            }
            else {
              uVar43 = (uint)LZCOUNT(uVar8);
            }
            uVar24 = uVar24 + uVar43;
          } while (0x3f < uVar43);
        }
        else {
          uVar43 = (uint)LZCOUNT(uVar8);
LAB_0016c579:
          uVar24 = uVar43;
          if (0x3f < uVar43) goto LAB_0016c585;
        }
        uVar8 = uVar8 << ((byte)uVar43 & 0x3f);
        uVar43 = mVar23 + uVar43;
        uVar25 = (uint)(uVar8 >> (bVar11 & 0x3f));
        if (uVar5 < uVar43) {
          uVar43 = uVar43 - uVar5;
          uVar37 = bs->nextL2Line;
          if ((ulong)uVar37 < 0x200) {
            uVar18 = bs->crc16;
            uVar19 = (uint)uVar18;
            if (bs->crc16CacheIgnoredBytes < 8) {
              mVar1 = bs->crc16Cache;
              uVar16 = (uint)mVar1;
              uVar2 = (ushort)(mVar1 >> 0x30);
              uVar49 = (uint)(mVar1 >> 0x10);
              uVar47 = (uint)(mVar1 >> 0x18);
              uVar13 = (uint)(mVar1 >> 0x20);
              switch(bs->crc16CacheIgnoredBytes) {
              case 0:
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar13 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar18 >> 8) ^
                                                     (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar2 ^
                                                    ((uint)uVar18 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar18 >> 8) ^
                                                           (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff
                                                    ) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar13 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar18 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar13 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar47 & 0xff] <<
                              8 ^ uVar16 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar13 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar18 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar13 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar13 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar18 >> 8) ^
                                                            (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar2 ^
                                                           ((uint)uVar18 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar18 >> 8) ^
                                                                  (uint)(byte)(mVar1 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] <<
                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                       [(uVar13 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar18 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar13 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            uVar47 & 0xff]) >> 8 & 0xff ^ uVar49 & 0xffff) & 0xff])
                             >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar13 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar18 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar13 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar13 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar18 >> 8) ^
                                                              (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar18 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar18 >> 8) ^
                                                                    (uint)(byte)(mVar1 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar13 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar13 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar47 & 0xff]) >> 8 & 0xff ^ uVar49 & 0xffff) & 0xff]
                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [((uint)ma_dr_flac__crc16_table
                                                            [(uVar13 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar13 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar13 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar47 & 0xff] << 8 ^ uVar16 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [(((uint)ma_dr_flac__crc16_table
                                                            [(uVar13 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar13 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar13 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar18 >> 8) ^
                                                                         (uint)(byte)(mVar1 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar18 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar13 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar13 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar47 & 0xff]) >> 8 & 0xff ^ uVar49 & 0xffff) &
                                                  0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar16) & 0xff]
                ;
                break;
              case 1:
                uVar19 = (uint)(ushort)(uVar18 << 8 ^
                                       ma_dr_flac__crc16_table[(ushort)(uVar2 ^ uVar18 >> 8) & 0xff]
                                       );
              case 2:
                uVar19 = (uint)(ushort)((ushort)(uVar19 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar13 ^ uVar19) >> 8 & 0xff]);
              case 3:
                uVar19 = (uint)(ushort)((ushort)(uVar19 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar13 ^ uVar19 >> 8) & 0xff]);
              case 4:
                uVar19 = (uint)(ushort)((ushort)(uVar19 << 8) ^
                                       ma_dr_flac__crc16_table[uVar19 >> 8 ^ uVar47 & 0xff]);
              case 5:
                uVar19 = (uint)(ushort)((ushort)(uVar19 << 8) ^
                                       ma_dr_flac__crc16_table
                                       [(uVar19 >> 8 ^ uVar49 & 0xffff) & 0xff]);
              case 6:
                uVar18 = (ushort)(uVar19 << 8) ^
                         ma_dr_flac__crc16_table[(uVar16 ^ uVar19) >> 8 & 0xff];
              case 7:
                uVar18 = uVar18 << 8 ^ ma_dr_flac__crc16_table[(uVar16 ^ uVar18 >> 8) & 0xff];
                goto LAB_0016caca;
              }
            }
            else {
LAB_0016caca:
              bs->crc16 = uVar18;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar37 + 1;
            uVar8 = bs->cacheL2[uVar37];
            uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                    (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                    (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                    (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
            bs->crc16Cache = uVar8;
            uVar37 = uVar43;
          }
          else {
            mVar6 = ma_dr_flac__reload_cache(bs);
            if (mVar6 == 0) {
              return 0;
            }
            if (0x40 - (ulong)bs->consumedBits < (ulong)uVar43) {
              return 0;
            }
            uVar8 = bs->cache;
            uVar37 = bs->consumedBits + uVar43;
          }
          uVar25 = uVar25 | (uint)(uVar8 >> (-(byte)uVar43 & 0x3f));
          uVar8 = uVar8 << ((byte)uVar43 & 0x3f);
        }
        else {
          uVar8 = uVar8 << (bVar12 & 0x3f);
          uVar37 = uVar43 + iVar4;
        }
        bs->cache = uVar8;
        bs->consumedBits = uVar37;
        uVar37 = local_100 << (riceParam & 0x1f) | local_f8 & uVar30;
        uVar47 = uVar27 << (riceParam & 0x1f) | local_f0 & uVar30;
        uVar19 = uVar17 << (riceParam & 0x1f) | local_98 & uVar30;
        uVar24 = uVar24 << (riceParam & 0x1f) | uVar25 & uVar30;
        uVar43 = *(uint *)(&DAT_0017a5e0 + (ulong)(uVar47 & 1) * 4);
        uVar27 = *(uint *)(&DAT_0017a5e0 + (ulong)(uVar19 & 1) * 4);
        uVar17 = *(uint *)(&DAT_0017a5e0 + (ulong)(uVar24 & 1) * 4);
        lVar36 = 0;
        iVar29 = lpcOrder - 1;
        switch(iVar29) {
        case 0x1f:
          lVar36 = (long)pSamplesOut[-0x20] * (long)coefficients[0x1f];
        case 0x1e:
          lVar36 = lVar36 + (long)pSamplesOut[-0x1f] * (long)coefficients[0x1e];
        case 0x1d:
          lVar36 = lVar36 + (long)pSamplesOut[-0x1e] * (long)coefficients[0x1d];
        case 0x1c:
          lVar36 = lVar36 + (long)pSamplesOut[-0x1d] * (long)coefficients[0x1c];
        case 0x1b:
          lVar36 = lVar36 + (long)pSamplesOut[-0x1c] * (long)coefficients[0x1b];
        case 0x1a:
          lVar36 = lVar36 + (long)pSamplesOut[-0x1b] * (long)coefficients[0x1a];
        case 0x19:
          lVar36 = lVar36 + (long)pSamplesOut[-0x1a] * (long)coefficients[0x19];
        case 0x18:
          lVar36 = lVar36 + (long)pSamplesOut[-0x19] * (long)coefficients[0x18];
        case 0x17:
          lVar36 = lVar36 + (long)pSamplesOut[-0x18] * (long)coefficients[0x17];
        case 0x16:
          lVar36 = lVar36 + (long)pSamplesOut[-0x17] * (long)coefficients[0x16];
        case 0x15:
          lVar36 = lVar36 + (long)pSamplesOut[-0x16] * (long)coefficients[0x15];
        case 0x14:
          lVar36 = lVar36 + (long)pSamplesOut[-0x15] * (long)coefficients[0x14];
        case 0x13:
          lVar36 = lVar36 + (long)pSamplesOut[-0x14] * (long)coefficients[0x13];
        case 0x12:
          lVar36 = lVar36 + (long)pSamplesOut[-0x13] * (long)coefficients[0x12];
        case 0x11:
          lVar36 = lVar36 + (long)pSamplesOut[-0x12] * (long)coefficients[0x11];
        case 0x10:
          lVar36 = lVar36 + (long)pSamplesOut[-0x11] * (long)coefficients[0x10];
        case 0xf:
          lVar36 = lVar36 + (long)pSamplesOut[-0x10] * (long)coefficients[0xf];
        case 0xe:
          lVar36 = lVar36 + (long)pSamplesOut[-0xf] * (long)coefficients[0xe];
        case 0xd:
          lVar36 = lVar36 + (long)pSamplesOut[-0xe] * (long)coefficients[0xd];
        case 0xc:
          lVar36 = lVar36 + (long)pSamplesOut[-0xd] * (long)coefficients[0xc];
        case 0xb:
          lVar36 = lVar36 + (long)pSamplesOut[-0xc] * (long)coefficients[0xb];
        case 10:
          lVar36 = lVar36 + (long)pSamplesOut[-0xb] * (long)coefficients[10];
        case 9:
          lVar36 = lVar36 + (long)pSamplesOut[-10] * (long)coefficients[9];
        case 8:
          lVar36 = lVar36 + (long)pSamplesOut[-9] * (long)coefficients[8];
        case 7:
          lVar36 = lVar36 + (long)pSamplesOut[-8] * (long)coefficients[7];
        case 6:
          lVar36 = lVar36 + (long)pSamplesOut[-7] * (long)coefficients[6];
        case 5:
          lVar36 = lVar36 + (long)pSamplesOut[-6] * (long)coefficients[5];
        case 4:
          lVar36 = lVar36 + (long)pSamplesOut[-5] * (long)coefficients[4];
        case 3:
          lVar36 = lVar36 + (long)pSamplesOut[-4] * (long)coefficients[3];
        case 2:
          lVar36 = lVar36 + (long)pSamplesOut[-3] * (long)coefficients[2];
        case 1:
          lVar36 = lVar36 + (long)pSamplesOut[-2] * (long)coefficients[1];
        case 0:
          lVar36 = lVar36 + (long)pSamplesOut[-1] * (long)*coefficients;
        }
        iVar35 = (uVar37 >> 1 ^ *(uint *)(&DAT_0017a5e0 + (ulong)(uVar37 & 1) * 4)) +
                 (int)(lVar36 >> (bVar10 & 0x3f));
        *pSamplesOut = iVar35;
        lVar40 = 0;
        lVar36 = (long)iVar35;
        switch(iVar29) {
        case 0x1f:
          lVar40 = (long)pSamplesOut[-0x1f] * (long)coefficients[0x1f];
        case 0x1e:
          lVar40 = lVar40 + (long)pSamplesOut[-0x1e] * (long)coefficients[0x1e];
        case 0x1d:
          lVar40 = lVar40 + (long)pSamplesOut[-0x1d] * (long)coefficients[0x1d];
        case 0x1c:
          lVar40 = lVar40 + (long)pSamplesOut[-0x1c] * (long)coefficients[0x1c];
        case 0x1b:
          lVar40 = lVar40 + (long)pSamplesOut[-0x1b] * (long)coefficients[0x1b];
        case 0x1a:
          lVar40 = lVar40 + (long)pSamplesOut[-0x1a] * (long)coefficients[0x1a];
        case 0x19:
          lVar40 = lVar40 + (long)pSamplesOut[-0x19] * (long)coefficients[0x19];
        case 0x18:
          lVar40 = lVar40 + (long)pSamplesOut[-0x18] * (long)coefficients[0x18];
        case 0x17:
          lVar40 = lVar40 + (long)pSamplesOut[-0x17] * (long)coefficients[0x17];
        case 0x16:
          lVar40 = lVar40 + (long)pSamplesOut[-0x16] * (long)coefficients[0x16];
        case 0x15:
          lVar40 = lVar40 + (long)pSamplesOut[-0x15] * (long)coefficients[0x15];
        case 0x14:
          lVar40 = lVar40 + (long)pSamplesOut[-0x14] * (long)coefficients[0x14];
        case 0x13:
          lVar40 = lVar40 + (long)pSamplesOut[-0x13] * (long)coefficients[0x13];
        case 0x12:
          lVar40 = lVar40 + (long)pSamplesOut[-0x12] * (long)coefficients[0x12];
        case 0x11:
          lVar40 = lVar40 + (long)pSamplesOut[-0x11] * (long)coefficients[0x11];
        case 0x10:
          lVar40 = lVar40 + (long)pSamplesOut[-0x10] * (long)coefficients[0x10];
        case 0xf:
          lVar40 = lVar40 + (long)pSamplesOut[-0xf] * (long)coefficients[0xf];
        case 0xe:
          lVar40 = lVar40 + (long)pSamplesOut[-0xe] * (long)coefficients[0xe];
        case 0xd:
          lVar40 = lVar40 + (long)pSamplesOut[-0xd] * (long)coefficients[0xd];
        case 0xc:
          lVar40 = lVar40 + (long)pSamplesOut[-0xc] * (long)coefficients[0xc];
        case 0xb:
          lVar40 = lVar40 + (long)pSamplesOut[-0xb] * (long)coefficients[0xb];
        case 10:
          lVar40 = lVar40 + (long)pSamplesOut[-10] * (long)coefficients[10];
        case 9:
          lVar40 = lVar40 + (long)pSamplesOut[-9] * (long)coefficients[9];
        case 8:
          lVar40 = lVar40 + (long)pSamplesOut[-8] * (long)coefficients[8];
        case 7:
          lVar40 = lVar40 + (long)pSamplesOut[-7] * (long)coefficients[7];
        case 6:
          lVar40 = lVar40 + (long)pSamplesOut[-6] * (long)coefficients[6];
        case 5:
          lVar40 = lVar40 + (long)pSamplesOut[-5] * (long)coefficients[5];
        case 4:
          lVar40 = lVar40 + (long)pSamplesOut[-4] * (long)coefficients[4];
        case 3:
          lVar40 = lVar40 + (long)pSamplesOut[-3] * (long)coefficients[3];
        case 2:
          lVar40 = lVar40 + (long)pSamplesOut[-2] * (long)coefficients[2];
        case 1:
          lVar40 = lVar40 + (long)pSamplesOut[-1] * (long)coefficients[1];
        case 0:
          lVar40 = lVar40 + *coefficients * lVar36;
        }
        iVar35 = (uVar47 >> 1 ^ uVar43) + (int)(lVar40 >> (bVar10 & 0x3f));
        pSamplesOut[1] = iVar35;
        lVar40 = 0;
        switch(iVar29) {
        case 0x1f:
          lVar40 = (long)pSamplesOut[-0x1e] * (long)coefficients[0x1f];
        case 0x1e:
          lVar40 = lVar40 + (long)pSamplesOut[-0x1d] * (long)coefficients[0x1e];
        case 0x1d:
          lVar40 = lVar40 + (long)pSamplesOut[-0x1c] * (long)coefficients[0x1d];
        case 0x1c:
          lVar40 = lVar40 + (long)pSamplesOut[-0x1b] * (long)coefficients[0x1c];
        case 0x1b:
          lVar40 = lVar40 + (long)pSamplesOut[-0x1a] * (long)coefficients[0x1b];
        case 0x1a:
          lVar40 = lVar40 + (long)pSamplesOut[-0x19] * (long)coefficients[0x1a];
        case 0x19:
          lVar40 = lVar40 + (long)pSamplesOut[-0x18] * (long)coefficients[0x19];
        case 0x18:
          lVar40 = lVar40 + (long)pSamplesOut[-0x17] * (long)coefficients[0x18];
        case 0x17:
          lVar40 = lVar40 + (long)pSamplesOut[-0x16] * (long)coefficients[0x17];
        case 0x16:
          lVar40 = lVar40 + (long)pSamplesOut[-0x15] * (long)coefficients[0x16];
        case 0x15:
          lVar40 = lVar40 + (long)pSamplesOut[-0x14] * (long)coefficients[0x15];
        case 0x14:
          lVar40 = lVar40 + (long)pSamplesOut[-0x13] * (long)coefficients[0x14];
        case 0x13:
          lVar40 = lVar40 + (long)pSamplesOut[-0x12] * (long)coefficients[0x13];
        case 0x12:
          lVar40 = lVar40 + (long)pSamplesOut[-0x11] * (long)coefficients[0x12];
        case 0x11:
          lVar40 = lVar40 + (long)pSamplesOut[-0x10] * (long)coefficients[0x11];
        case 0x10:
          lVar40 = lVar40 + (long)pSamplesOut[-0xf] * (long)coefficients[0x10];
        case 0xf:
          lVar40 = lVar40 + (long)pSamplesOut[-0xe] * (long)coefficients[0xf];
        case 0xe:
          lVar40 = lVar40 + (long)pSamplesOut[-0xd] * (long)coefficients[0xe];
        case 0xd:
          lVar40 = lVar40 + (long)pSamplesOut[-0xc] * (long)coefficients[0xd];
        case 0xc:
          lVar40 = lVar40 + (long)pSamplesOut[-0xb] * (long)coefficients[0xc];
        case 0xb:
          lVar40 = lVar40 + (long)pSamplesOut[-10] * (long)coefficients[0xb];
        case 10:
          lVar40 = lVar40 + (long)pSamplesOut[-9] * (long)coefficients[10];
        case 9:
          lVar40 = lVar40 + (long)pSamplesOut[-8] * (long)coefficients[9];
        case 8:
          lVar40 = lVar40 + (long)pSamplesOut[-7] * (long)coefficients[8];
        case 7:
          lVar40 = lVar40 + (long)pSamplesOut[-6] * (long)coefficients[7];
        case 6:
          lVar40 = lVar40 + (long)pSamplesOut[-5] * (long)coefficients[6];
        case 5:
          lVar40 = lVar40 + (long)pSamplesOut[-4] * (long)coefficients[5];
        case 4:
          lVar40 = lVar40 + (long)pSamplesOut[-3] * (long)coefficients[4];
        case 3:
          lVar40 = lVar40 + (long)pSamplesOut[-2] * (long)coefficients[3];
        case 2:
          lVar40 = lVar40 + (long)pSamplesOut[-1] * (long)coefficients[2];
        case 1:
          lVar40 = lVar40 + coefficients[1] * lVar36;
        case 0:
          lVar40 = lVar40 + (long)*coefficients * (long)iVar35;
        }
        iVar42 = (uVar19 >> 1 ^ uVar27) + (int)(lVar40 >> (bVar10 & 0x3f));
        pSamplesOut[2] = iVar42;
        lVar40 = 0;
        switch(iVar29) {
        case 0x1f:
          lVar40 = (long)pSamplesOut[-0x1d] * (long)coefficients[0x1f];
        case 0x1e:
          lVar40 = lVar40 + (long)pSamplesOut[-0x1c] * (long)coefficients[0x1e];
        case 0x1d:
          lVar40 = lVar40 + (long)pSamplesOut[-0x1b] * (long)coefficients[0x1d];
        case 0x1c:
          lVar40 = lVar40 + (long)pSamplesOut[-0x1a] * (long)coefficients[0x1c];
        case 0x1b:
          lVar40 = lVar40 + (long)pSamplesOut[-0x19] * (long)coefficients[0x1b];
        case 0x1a:
          lVar40 = lVar40 + (long)pSamplesOut[-0x18] * (long)coefficients[0x1a];
        case 0x19:
          lVar40 = lVar40 + (long)pSamplesOut[-0x17] * (long)coefficients[0x19];
        case 0x18:
          lVar40 = lVar40 + (long)pSamplesOut[-0x16] * (long)coefficients[0x18];
        case 0x17:
          lVar40 = lVar40 + (long)pSamplesOut[-0x15] * (long)coefficients[0x17];
        case 0x16:
          lVar40 = lVar40 + (long)pSamplesOut[-0x14] * (long)coefficients[0x16];
        case 0x15:
          lVar40 = lVar40 + (long)pSamplesOut[-0x13] * (long)coefficients[0x15];
        case 0x14:
          lVar40 = lVar40 + (long)pSamplesOut[-0x12] * (long)coefficients[0x14];
        case 0x13:
          lVar40 = lVar40 + (long)pSamplesOut[-0x11] * (long)coefficients[0x13];
        case 0x12:
          lVar40 = lVar40 + (long)pSamplesOut[-0x10] * (long)coefficients[0x12];
        case 0x11:
          lVar40 = lVar40 + (long)pSamplesOut[-0xf] * (long)coefficients[0x11];
        case 0x10:
          lVar40 = lVar40 + (long)pSamplesOut[-0xe] * (long)coefficients[0x10];
        case 0xf:
          lVar40 = lVar40 + (long)pSamplesOut[-0xd] * (long)coefficients[0xf];
        case 0xe:
          lVar40 = lVar40 + (long)pSamplesOut[-0xc] * (long)coefficients[0xe];
        case 0xd:
          lVar40 = lVar40 + (long)pSamplesOut[-0xb] * (long)coefficients[0xd];
        case 0xc:
          lVar40 = lVar40 + (long)pSamplesOut[-10] * (long)coefficients[0xc];
        case 0xb:
          lVar40 = lVar40 + (long)pSamplesOut[-9] * (long)coefficients[0xb];
        case 10:
          lVar40 = lVar40 + (long)pSamplesOut[-8] * (long)coefficients[10];
        case 9:
          lVar40 = lVar40 + (long)pSamplesOut[-7] * (long)coefficients[9];
        case 8:
          lVar40 = lVar40 + (long)pSamplesOut[-6] * (long)coefficients[8];
        case 7:
          lVar40 = lVar40 + (long)pSamplesOut[-5] * (long)coefficients[7];
        case 6:
          lVar40 = lVar40 + (long)pSamplesOut[-4] * (long)coefficients[6];
        case 5:
          lVar40 = lVar40 + (long)pSamplesOut[-3] * (long)coefficients[5];
        case 4:
          lVar40 = lVar40 + (long)pSamplesOut[-2] * (long)coefficients[4];
        case 3:
          lVar40 = lVar40 + (long)pSamplesOut[-1] * (long)coefficients[3];
        case 2:
          lVar40 = lVar40 + lVar36 * coefficients[2];
        case 1:
          lVar40 = lVar40 + (long)iVar35 * (long)coefficients[1];
        case 0:
          lVar40 = lVar40 + (long)iVar42 * (long)*coefficients;
        }
        pSamplesOut[3] = (uVar24 >> 1 ^ uVar17) + (int)(lVar40 >> (bVar10 & 0x3f));
        pSamplesOut = pSamplesOut + 4;
      } while (pSamplesOut < piVar7);
    }
    if (uVar46 != count) {
      iVar4 = riceParam + 1;
      uVar5 = 0x3f - riceParam;
      uVar8 = bs->cache;
      do {
        mVar23 = bs->consumedBits;
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (uVar8 != 0) {
            if (uVar8 < 0x1000000000000000) {
              bVar52 = uVar8 >> 0x20 == 0;
              uVar21 = uVar8 << 0x20;
              if (!bVar52) {
                uVar21 = uVar8;
              }
              iVar35 = (uint)bVar52 * 0x20;
              iVar29 = iVar35 + 0x10;
              uVar3 = uVar21 << 0x10;
              if (0xffffffffffff < uVar21) {
                iVar29 = iVar35;
                uVar3 = uVar21;
              }
              iVar35 = iVar29 + 8;
              uVar21 = uVar3 << 8;
              if (0xffffffffffffff < uVar3) {
                iVar35 = iVar29;
                uVar21 = uVar3;
              }
              iVar29 = iVar35 + 4;
              uVar3 = uVar21 << 4;
              if (0xfffffffffffffff < uVar21) {
                iVar29 = iVar35;
                uVar3 = uVar21;
              }
              iVar29 = iVar29 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                        (uVar3 >> 0x3c) * 4);
            }
            else {
              iVar29 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                               (uVar8 >> 0x3c) * 4);
            }
            uVar46 = iVar29 - 1;
            goto LAB_0016d50f;
          }
LAB_0016d51d:
          uVar43 = 0x40 - mVar23;
          do {
            uVar46 = bs->nextL2Line;
            if ((ulong)uVar46 < 0x200) {
              uVar18 = bs->crc16;
              uVar27 = (uint)uVar18;
              if (bs->crc16CacheIgnoredBytes < 8) {
                mVar1 = bs->crc16Cache;
                uVar37 = (uint)mVar1;
                uVar2 = (ushort)(mVar1 >> 0x30);
                uVar24 = (uint)(mVar1 >> 0x10);
                uVar17 = (uint)(mVar1 >> 0x18);
                uVar25 = (uint)(mVar1 >> 0x20);
                switch(bs->crc16CacheIgnoredBytes) {
                case 0:
                  bs->crc16 = ma_dr_flac__crc16_table
                              [((uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [(uVar25 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar18 >> 8) ^
                                                       (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar2 ^
                                                      ((uint)uVar18 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar18 >> 8) ^
                                                             (uint)(byte)(mVar1 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar25 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar2 ^
                                                                              ((uint)uVar18 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar17 & 0xff] <<
                                8 ^ uVar37 ^
                               (uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar18 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar25 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar25 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar18 >> 8) ^
                                                              (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar18 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar18 >> 8) ^
                                                                    (uint)(byte)(mVar1 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar25 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar25 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar17 & 0xff]) >> 8 & 0xff ^ uVar24 & 0xffff) & 0xff]
                               ) >> 8 & 0xff] << 8 ^
                              ma_dr_flac__crc16_table
                              [(((uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar18 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff] << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uVar25 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar18 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [((uint)ma_dr_flac__crc16_table
                                                       [(uVar25 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar18 >> 8) ^
                                                                (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar18 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar25 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                uVar17 & 0xff]) >> 8 & 0xff ^ uVar24 & 0xffff) &
                                        0xff] << 8 ^
                                (uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [((uint)ma_dr_flac__crc16_table
                                                      [(uVar25 >> 8 ^
                                                       ((uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar18 >> 8) ^
                                                               (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar18 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                       0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar18 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar25 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                               uVar17 & 0xff] << 8 ^ uVar37 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(((uint)ma_dr_flac__crc16_table
                                                      [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar25 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar25 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar25 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar25 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar17 & 0xff]) >> 8 & 0xff ^ uVar24 & 0xffff) &
                                              0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar37) & 0xff];
                  break;
                case 1:
                  uVar27 = (uint)(ushort)(uVar18 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)(uVar2 ^ uVar18 >> 8) & 0xff]);
                case 2:
                  uVar27 = (uint)(ushort)((ushort)(uVar27 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar25 ^ uVar27) >> 8 & 0xff]);
                case 3:
                  uVar27 = (uint)(ushort)((ushort)(uVar27 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar25 ^ uVar27 >> 8) & 0xff]);
                case 4:
                  uVar27 = (uint)(ushort)((ushort)(uVar27 << 8) ^
                                         ma_dr_flac__crc16_table[uVar27 >> 8 ^ uVar17 & 0xff]);
                case 5:
                  uVar27 = (uint)(ushort)((ushort)(uVar27 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar27 >> 8 ^ uVar24 & 0xffff) & 0xff]);
                case 6:
                  uVar18 = (ushort)(uVar27 << 8) ^
                           ma_dr_flac__crc16_table[(uVar37 ^ uVar27) >> 8 & 0xff];
                case 7:
                  uVar18 = uVar18 << 8 ^ ma_dr_flac__crc16_table[(uVar37 ^ uVar18 >> 8) & 0xff];
                  goto LAB_0016d6ed;
                }
              }
              else {
LAB_0016d6ed:
                bs->crc16 = uVar18;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar46 + 1;
              uVar8 = bs->cacheL2[uVar46];
              uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                      (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                      (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                      (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
              bs->crc16Cache = uVar8;
              mVar23 = 0;
            }
            else {
              mVar6 = ma_dr_flac__reload_cache(bs);
              if (mVar6 == 0) {
                return 0;
              }
              uVar8 = bs->cache;
              mVar23 = bs->consumedBits;
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              if (uVar8 == 0) {
                uVar46 = 0x40;
              }
              else {
                if (uVar8 < 0x1000000000000000) {
                  bVar52 = uVar8 >> 0x20 == 0;
                  uVar21 = uVar8 << 0x20;
                  if (!bVar52) {
                    uVar21 = uVar8;
                  }
                  iVar35 = (uint)bVar52 * 0x20;
                  iVar29 = iVar35 + 0x10;
                  uVar3 = uVar21 << 0x10;
                  if (0xffffffffffff < uVar21) {
                    iVar29 = iVar35;
                    uVar3 = uVar21;
                  }
                  iVar35 = iVar29 + 8;
                  uVar21 = uVar3 << 8;
                  if (0xffffffffffffff < uVar3) {
                    iVar35 = iVar29;
                    uVar21 = uVar3;
                  }
                  iVar29 = iVar35 + 4;
                  uVar3 = uVar21 << 4;
                  if (0xfffffffffffffff < uVar21) {
                    iVar29 = iVar35;
                    uVar3 = uVar21;
                  }
                  iVar29 = iVar29 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                             clz_table_4 + (uVar3 >> 0x3c) * 4);
                }
                else {
                  iVar29 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                   (uVar8 >> 0x3c) * 4);
                }
                uVar46 = iVar29 - 1;
              }
            }
            else {
              uVar46 = (uint)LZCOUNT(uVar8);
            }
            uVar43 = uVar43 + uVar46;
          } while (0x3f < uVar46);
        }
        else {
          uVar46 = (uint)LZCOUNT(uVar8);
LAB_0016d50f:
          uVar43 = uVar46;
          if (0x3f < uVar46) goto LAB_0016d51d;
        }
        uVar8 = uVar8 << ((byte)uVar46 & 0x3f);
        uVar46 = mVar23 + uVar46;
        uVar27 = (uint)(uVar8 >> ((byte)uVar5 & 0x3f));
        if (uVar5 < uVar46) {
          uVar46 = uVar46 - uVar5;
          uVar17 = bs->nextL2Line;
          if ((ulong)uVar17 < 0x200) {
            uVar18 = bs->crc16;
            uVar24 = (uint)uVar18;
            if (bs->crc16CacheIgnoredBytes < 8) {
              mVar1 = bs->crc16Cache;
              uVar47 = (uint)mVar1;
              uVar2 = (ushort)(mVar1 >> 0x30);
              uVar37 = (uint)(mVar1 >> 0x10);
              uVar25 = (uint)(mVar1 >> 0x18);
              uVar19 = (uint)(mVar1 >> 0x20);
              switch(bs->crc16CacheIgnoredBytes) {
              case 0:
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar19 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar18 >> 8) ^
                                                     (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar2 ^
                                                    ((uint)uVar18 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar18 >> 8) ^
                                                           (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff
                                                    ) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar18 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar19 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar25 & 0xff] <<
                              8 ^ uVar47 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar18 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar19 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar18 >> 8) ^
                                                                      (uint)(byte)(mVar1 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar19 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar18 >> 8) ^
                                                            (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar2 ^
                                                           ((uint)uVar18 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar18 >> 8) ^
                                                                  (uint)(byte)(mVar1 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] <<
                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                       [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar18 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            uVar25 & 0xff]) >> 8 & 0xff ^ uVar37 & 0xffff) & 0xff])
                             >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar18 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar19 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar18 >> 8) ^
                                                                        (uint)(byte)(mVar1 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar19 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar18 >> 8) ^
                                                              (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar18 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar18 >> 8) ^
                                                                    (uint)(byte)(mVar1 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar19 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar25 & 0xff]) >> 8 & 0xff ^ uVar37 & 0xffff) & 0xff]
                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [((uint)ma_dr_flac__crc16_table
                                                            [(uVar19 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar18 >> 8) ^
                                                                     (uint)(byte)(mVar1 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar18 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar25 & 0xff] << 8 ^ uVar47 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [(((uint)ma_dr_flac__crc16_table
                                                            [(uVar19 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar18 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar18 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar19 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar18 >> 8) ^
                                                                         (uint)(byte)(mVar1 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar18 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar19 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar18 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar18 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar19 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar18 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar18 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar18 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar25 & 0xff]) >> 8 & 0xff ^ uVar37 & 0xffff) &
                                                  0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar47) & 0xff]
                ;
                break;
              case 1:
                uVar24 = (uint)(ushort)(uVar18 << 8 ^
                                       ma_dr_flac__crc16_table[(ushort)(uVar2 ^ uVar18 >> 8) & 0xff]
                                       );
              case 2:
                uVar24 = (uint)(ushort)((ushort)(uVar24 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar19 ^ uVar24) >> 8 & 0xff]);
              case 3:
                uVar24 = (uint)(ushort)((ushort)(uVar24 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar19 ^ uVar24 >> 8) & 0xff]);
              case 4:
                uVar24 = (uint)(ushort)((ushort)(uVar24 << 8) ^
                                       ma_dr_flac__crc16_table[uVar24 >> 8 ^ uVar25 & 0xff]);
              case 5:
                uVar24 = (uint)(ushort)((ushort)(uVar24 << 8) ^
                                       ma_dr_flac__crc16_table
                                       [(uVar24 >> 8 ^ uVar37 & 0xffff) & 0xff]);
              case 6:
                uVar18 = (ushort)(uVar24 << 8) ^
                         ma_dr_flac__crc16_table[(uVar47 ^ uVar24) >> 8 & 0xff];
              case 7:
                uVar18 = uVar18 << 8 ^
                         ma_dr_flac__crc16_table[(uVar47 ^ (byte)(uVar18 >> 8)) & 0xff];
                goto LAB_0016da07;
              }
            }
            else {
LAB_0016da07:
              bs->crc16 = uVar18;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar17 + 1;
            uVar8 = bs->cacheL2[uVar17];
            uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                    (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                    (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                    (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
            bs->crc16Cache = uVar8;
            uVar17 = uVar46;
          }
          else {
            mVar6 = ma_dr_flac__reload_cache(bs);
            if (mVar6 == 0) {
              return 0;
            }
            if (0x40 - (ulong)bs->consumedBits < (ulong)uVar46) {
              return 0;
            }
            uVar8 = bs->cache;
            uVar17 = bs->consumedBits + uVar46;
          }
          uVar27 = uVar27 | (uint)(uVar8 >> (-(byte)uVar46 & 0x3f));
          uVar8 = uVar8 << ((byte)uVar46 & 0x3f);
        }
        else {
          uVar8 = uVar8 << ((byte)iVar4 & 0x3f);
          uVar17 = uVar46 + iVar4;
        }
        bs->cache = uVar8;
        bs->consumedBits = uVar17;
        uVar43 = uVar43 << (riceParam & 0x1f) | uVar27 & uVar30;
        uVar21 = (ulong)lpcOrder;
        uVar46 = bitsPerSample + lpcPrecision;
        do {
          uVar46 = uVar46 + 1;
          uVar27 = (uint)uVar21;
          uVar21 = uVar21 >> 1;
        } while (1 < uVar27);
        if (uVar46 < 0x21) {
          iVar29 = 0;
          switch(lpcOrder) {
          case 0x20:
            iVar29 = pSamplesOut[-0x20] * coefficients[0x1f];
          case 0x1f:
            iVar29 = iVar29 + pSamplesOut[-0x1f] * coefficients[0x1e];
          case 0x1e:
            iVar29 = iVar29 + pSamplesOut[-0x1e] * coefficients[0x1d];
          case 0x1d:
            iVar29 = iVar29 + pSamplesOut[-0x1d] * coefficients[0x1c];
          case 0x1c:
            iVar29 = iVar29 + pSamplesOut[-0x1c] * coefficients[0x1b];
          case 0x1b:
            iVar29 = iVar29 + pSamplesOut[-0x1b] * coefficients[0x1a];
          case 0x1a:
            iVar29 = iVar29 + pSamplesOut[-0x1a] * coefficients[0x19];
          case 0x19:
            iVar29 = iVar29 + pSamplesOut[-0x19] * coefficients[0x18];
          case 0x18:
            iVar29 = iVar29 + pSamplesOut[-0x18] * coefficients[0x17];
          case 0x17:
            iVar29 = iVar29 + pSamplesOut[-0x17] * coefficients[0x16];
          case 0x16:
            iVar29 = iVar29 + pSamplesOut[-0x16] * coefficients[0x15];
          case 0x15:
            iVar29 = iVar29 + pSamplesOut[-0x15] * coefficients[0x14];
          case 0x14:
            iVar29 = iVar29 + pSamplesOut[-0x14] * coefficients[0x13];
          case 0x13:
            iVar29 = iVar29 + pSamplesOut[-0x13] * coefficients[0x12];
          case 0x12:
            iVar29 = iVar29 + pSamplesOut[-0x12] * coefficients[0x11];
          case 0x11:
            iVar29 = iVar29 + pSamplesOut[-0x11] * coefficients[0x10];
          case 0x10:
            iVar29 = iVar29 + pSamplesOut[-0x10] * coefficients[0xf];
          case 0xf:
            iVar29 = iVar29 + pSamplesOut[-0xf] * coefficients[0xe];
          case 0xe:
            iVar29 = iVar29 + pSamplesOut[-0xe] * coefficients[0xd];
          case 0xd:
            iVar29 = iVar29 + pSamplesOut[-0xd] * coefficients[0xc];
          case 0xc:
            iVar29 = iVar29 + pSamplesOut[-0xc] * coefficients[0xb];
          case 0xb:
            iVar29 = iVar29 + pSamplesOut[-0xb] * coefficients[10];
          case 10:
            iVar29 = iVar29 + pSamplesOut[-10] * coefficients[9];
          case 9:
            iVar29 = iVar29 + pSamplesOut[-9] * coefficients[8];
          case 8:
            iVar29 = iVar29 + pSamplesOut[-8] * coefficients[7];
          case 7:
            iVar29 = iVar29 + pSamplesOut[-7] * coefficients[6];
          case 6:
            iVar29 = iVar29 + pSamplesOut[-6] * coefficients[5];
          case 5:
            iVar29 = iVar29 + pSamplesOut[-5] * coefficients[4];
          case 4:
            iVar29 = iVar29 + pSamplesOut[-4] * coefficients[3];
          case 3:
            iVar29 = iVar29 + pSamplesOut[-3] * coefficients[2];
          case 2:
            iVar29 = iVar29 + pSamplesOut[-2] * coefficients[1];
          case 1:
            iVar29 = iVar29 + pSamplesOut[-1] * *coefficients;
          default:
            iVar29 = iVar29 >> (bVar10 & 0x1f);
          }
        }
        else {
          lVar36 = 0;
          switch(lpcOrder) {
          case 0x20:
            lVar36 = (long)pSamplesOut[-0x20] * (long)coefficients[0x1f];
          case 0x1f:
            lVar36 = lVar36 + (long)pSamplesOut[-0x1f] * (long)coefficients[0x1e];
          case 0x1e:
            lVar36 = lVar36 + (long)pSamplesOut[-0x1e] * (long)coefficients[0x1d];
          case 0x1d:
            lVar36 = lVar36 + (long)pSamplesOut[-0x1d] * (long)coefficients[0x1c];
          case 0x1c:
            lVar36 = lVar36 + (long)pSamplesOut[-0x1c] * (long)coefficients[0x1b];
          case 0x1b:
            lVar36 = lVar36 + (long)pSamplesOut[-0x1b] * (long)coefficients[0x1a];
          case 0x1a:
            lVar36 = lVar36 + (long)pSamplesOut[-0x1a] * (long)coefficients[0x19];
          case 0x19:
            lVar36 = lVar36 + (long)pSamplesOut[-0x19] * (long)coefficients[0x18];
          case 0x18:
            lVar36 = lVar36 + (long)pSamplesOut[-0x18] * (long)coefficients[0x17];
          case 0x17:
            lVar36 = lVar36 + (long)pSamplesOut[-0x17] * (long)coefficients[0x16];
          case 0x16:
            lVar36 = lVar36 + (long)pSamplesOut[-0x16] * (long)coefficients[0x15];
          case 0x15:
            lVar36 = lVar36 + (long)pSamplesOut[-0x15] * (long)coefficients[0x14];
          case 0x14:
            lVar36 = lVar36 + (long)pSamplesOut[-0x14] * (long)coefficients[0x13];
          case 0x13:
            lVar36 = lVar36 + (long)pSamplesOut[-0x13] * (long)coefficients[0x12];
          case 0x12:
            lVar36 = lVar36 + (long)pSamplesOut[-0x12] * (long)coefficients[0x11];
          case 0x11:
            lVar36 = lVar36 + (long)pSamplesOut[-0x11] * (long)coefficients[0x10];
          case 0x10:
            lVar36 = lVar36 + (long)pSamplesOut[-0x10] * (long)coefficients[0xf];
          case 0xf:
            lVar36 = lVar36 + (long)pSamplesOut[-0xf] * (long)coefficients[0xe];
          case 0xe:
            lVar36 = lVar36 + (long)pSamplesOut[-0xe] * (long)coefficients[0xd];
          case 0xd:
            lVar36 = lVar36 + (long)pSamplesOut[-0xd] * (long)coefficients[0xc];
          case 0xc:
            lVar36 = lVar36 + (long)pSamplesOut[-0xc] * (long)coefficients[0xb];
          case 0xb:
            lVar36 = lVar36 + (long)pSamplesOut[-0xb] * (long)coefficients[10];
          case 10:
            lVar36 = lVar36 + (long)pSamplesOut[-10] * (long)coefficients[9];
          case 9:
            lVar36 = lVar36 + (long)pSamplesOut[-9] * (long)coefficients[8];
          case 8:
            lVar36 = lVar36 + (long)pSamplesOut[-8] * (long)coefficients[7];
          case 7:
            lVar36 = lVar36 + (long)pSamplesOut[-7] * (long)coefficients[6];
          case 6:
            lVar36 = lVar36 + (long)pSamplesOut[-6] * (long)coefficients[5];
          case 5:
            lVar36 = lVar36 + (long)pSamplesOut[-5] * (long)coefficients[4];
          case 4:
            lVar36 = lVar36 + (long)pSamplesOut[-4] * (long)coefficients[3];
          case 3:
            lVar36 = lVar36 + (long)pSamplesOut[-3] * (long)coefficients[2];
          case 2:
            lVar36 = lVar36 + (long)pSamplesOut[-2] * (long)coefficients[1];
          case 1:
            lVar36 = lVar36 + (long)pSamplesOut[-1] * (long)*coefficients;
          default:
            iVar29 = (int)(lVar36 >> (bVar10 & 0x3f));
          }
        }
        *pSamplesOut = (*(uint *)(&DAT_0017a5e0 + (ulong)(uVar43 & 1) * 4) ^ uVar43 >> 1) + iVar29;
        uVar46 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar46;
        pSamplesOut = pSamplesOut + 1;
      } while (uVar46 < count);
    }
  }
  return 1;
}

Assistant:

static ma_bool32 ma_dr_flac__decode_samples_with_residual__rice__scalar(ma_dr_flac_bs* bs, ma_uint32 bitsPerSample, ma_uint32 count, ma_uint8 riceParam, ma_uint32 lpcOrder, ma_int32 lpcShift, ma_uint32 lpcPrecision, const ma_int32* coefficients, ma_int32* pSamplesOut)
{
    ma_uint32 t[2] = {0x00000000, 0xFFFFFFFF};
    ma_uint32 zeroCountPart0 = 0;
    ma_uint32 zeroCountPart1 = 0;
    ma_uint32 zeroCountPart2 = 0;
    ma_uint32 zeroCountPart3 = 0;
    ma_uint32 riceParamPart0 = 0;
    ma_uint32 riceParamPart1 = 0;
    ma_uint32 riceParamPart2 = 0;
    ma_uint32 riceParamPart3 = 0;
    ma_uint32 riceParamMask;
    const ma_int32* pSamplesOutEnd;
    ma_uint32 i;
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(pSamplesOut != NULL);
    if (lpcOrder == 0) {
        return ma_dr_flac__decode_samples_with_residual__rice__scalar_zeroorder(bs, bitsPerSample, count, riceParam, lpcOrder, lpcShift, coefficients, pSamplesOut);
    }
    riceParamMask  = (ma_uint32)~((~0UL) << riceParam);
    pSamplesOutEnd = pSamplesOut + (count & ~3);
    if (ma_dr_flac__use_64_bit_prediction(bitsPerSample, lpcOrder, lpcPrecision)) {
        while (pSamplesOut < pSamplesOutEnd) {
            if (!ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart0, &riceParamPart0) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart1, &riceParamPart1) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart2, &riceParamPart2) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart3, &riceParamPart3)) {
                return MA_FALSE;
            }
            riceParamPart0 &= riceParamMask;
            riceParamPart1 &= riceParamMask;
            riceParamPart2 &= riceParamMask;
            riceParamPart3 &= riceParamMask;
            riceParamPart0 |= (zeroCountPart0 << riceParam);
            riceParamPart1 |= (zeroCountPart1 << riceParam);
            riceParamPart2 |= (zeroCountPart2 << riceParam);
            riceParamPart3 |= (zeroCountPart3 << riceParam);
            riceParamPart0  = (riceParamPart0 >> 1) ^ t[riceParamPart0 & 0x01];
            riceParamPart1  = (riceParamPart1 >> 1) ^ t[riceParamPart1 & 0x01];
            riceParamPart2  = (riceParamPart2 >> 1) ^ t[riceParamPart2 & 0x01];
            riceParamPart3  = (riceParamPart3 >> 1) ^ t[riceParamPart3 & 0x01];
            pSamplesOut[0] = riceParamPart0 + ma_dr_flac__calculate_prediction_64(lpcOrder, lpcShift, coefficients, pSamplesOut + 0);
            pSamplesOut[1] = riceParamPart1 + ma_dr_flac__calculate_prediction_64(lpcOrder, lpcShift, coefficients, pSamplesOut + 1);
            pSamplesOut[2] = riceParamPart2 + ma_dr_flac__calculate_prediction_64(lpcOrder, lpcShift, coefficients, pSamplesOut + 2);
            pSamplesOut[3] = riceParamPart3 + ma_dr_flac__calculate_prediction_64(lpcOrder, lpcShift, coefficients, pSamplesOut + 3);
            pSamplesOut += 4;
        }
    } else {
        while (pSamplesOut < pSamplesOutEnd) {
            if (!ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart0, &riceParamPart0) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart1, &riceParamPart1) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart2, &riceParamPart2) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart3, &riceParamPart3)) {
                return MA_FALSE;
            }
            riceParamPart0 &= riceParamMask;
            riceParamPart1 &= riceParamMask;
            riceParamPart2 &= riceParamMask;
            riceParamPart3 &= riceParamMask;
            riceParamPart0 |= (zeroCountPart0 << riceParam);
            riceParamPart1 |= (zeroCountPart1 << riceParam);
            riceParamPart2 |= (zeroCountPart2 << riceParam);
            riceParamPart3 |= (zeroCountPart3 << riceParam);
            riceParamPart0  = (riceParamPart0 >> 1) ^ t[riceParamPart0 & 0x01];
            riceParamPart1  = (riceParamPart1 >> 1) ^ t[riceParamPart1 & 0x01];
            riceParamPart2  = (riceParamPart2 >> 1) ^ t[riceParamPart2 & 0x01];
            riceParamPart3  = (riceParamPart3 >> 1) ^ t[riceParamPart3 & 0x01];
            pSamplesOut[0] = riceParamPart0 + ma_dr_flac__calculate_prediction_32(lpcOrder, lpcShift, coefficients, pSamplesOut + 0);
            pSamplesOut[1] = riceParamPart1 + ma_dr_flac__calculate_prediction_32(lpcOrder, lpcShift, coefficients, pSamplesOut + 1);
            pSamplesOut[2] = riceParamPart2 + ma_dr_flac__calculate_prediction_32(lpcOrder, lpcShift, coefficients, pSamplesOut + 2);
            pSamplesOut[3] = riceParamPart3 + ma_dr_flac__calculate_prediction_32(lpcOrder, lpcShift, coefficients, pSamplesOut + 3);
            pSamplesOut += 4;
        }
    }
    i = (count & ~3);
    while (i < count) {
        if (!ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart0, &riceParamPart0)) {
            return MA_FALSE;
        }
        riceParamPart0 &= riceParamMask;
        riceParamPart0 |= (zeroCountPart0 << riceParam);
        riceParamPart0  = (riceParamPart0 >> 1) ^ t[riceParamPart0 & 0x01];
        if (ma_dr_flac__use_64_bit_prediction(bitsPerSample, lpcOrder, lpcPrecision)) {
            pSamplesOut[0] = riceParamPart0 + ma_dr_flac__calculate_prediction_64(lpcOrder, lpcShift, coefficients, pSamplesOut + 0);
        } else {
            pSamplesOut[0] = riceParamPart0 + ma_dr_flac__calculate_prediction_32(lpcOrder, lpcShift, coefficients, pSamplesOut + 0);
        }
        i += 1;
        pSamplesOut += 1;
    }
    return MA_TRUE;
}